

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void iterator_compact_uncommitted_db(void)

{
  uint8_t *puVar1;
  list_elem **pplVar2;
  uint64_t *__s;
  fdb_seqnum_t *__s_00;
  bottom_up_build_ctx *__s_01;
  fdb_commit_opt_t opt;
  fdb_file_handle *pfVar3;
  fdb_iterator *pfVar4;
  avl_node *paVar5;
  btree_iterator *pbVar6;
  fdb_doc *doc;
  btree *pbVar7;
  size_t *psVar8;
  size_t keylen;
  fdb_config *pfVar9;
  long lVar10;
  undefined1 *puVar11;
  fdb_status fVar12;
  int iVar13;
  __atomic_base<unsigned_long> _Var14;
  size_t sVar15;
  __atomic_base<unsigned_long> _Var16;
  size_t sVar17;
  size_t sVar18;
  uint uVar19;
  __atomic_base<unsigned_long> _Var20;
  fdb_kvs_handle *pfVar21;
  __atomic_base<unsigned_long> _Var22;
  __atomic_base<unsigned_long> _Var23;
  ulong uVar24;
  char *fconfig_00;
  atomic<unsigned_char> *fconfig_01;
  fdb_doc *pfVar25;
  list *doc_00;
  btreeblk_handle *pbVar26;
  fdb_kvs_handle *pfVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  undefined1 *puVar31;
  undefined1 *puVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  undefined1 *puVar37;
  undefined1 *puVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  undefined1 *puVar41;
  undefined1 *puVar42;
  undefined1 *puVar43;
  undefined1 *puVar44;
  undefined1 *puVar45;
  undefined1 *puVar46;
  undefined1 *puVar47;
  undefined1 *puVar48;
  undefined1 *puVar49;
  undefined1 *puVar50;
  undefined1 *puVar51;
  undefined1 *puVar52;
  fdb_kvs_handle *pfVar53;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar54;
  char *pcVar55;
  char *pcVar56;
  filemgr *pfVar57;
  long lVar58;
  btreeblk_handle *pbVar59;
  char *doc_01;
  char *pcVar60;
  filemgr *pfVar61;
  ulong uVar62;
  void *pvVar63;
  bool bVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  fdb_iterator *it;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char keybuf [256];
  fdb_config fconfig;
  uint8_t auStackY_11f01 [1805];
  fdb_commit_opt_t afStackY_117f4 [4132];
  fdb_kvs_handle afStack_107c0 [125];
  undefined8 uStack_858;
  undefined1 auStack_840 [8];
  fdb_config fStack_838;
  btreeblk_handle abStack_740 [2];
  int64_t aiStack_640 [32];
  list_elem *aplStack_540 [33];
  timeval tStack_438;
  undefined1 auStack_428 [32];
  btreeblk_handle *apbStack_408 [7];
  btreeblk_handle *pbStack_3d0;
  btreeblk_handle *pbStack_3c8;
  __atomic_base<unsigned_long> _Stack_3c0;
  undefined1 auStack_3b8 [8];
  undefined1 auStack_3b0 [16];
  __atomic_base<unsigned_long> _Stack_3a0;
  atomic<unsigned_long> aStack_398;
  atomic<unsigned_long> aStack_390;
  atomic<unsigned_long> aStack_380;
  char *pcStack_378;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_370;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 local_368;
  filemgr *local_360;
  __atomic_base<unsigned_long> local_358;
  timeval local_350;
  fdb_kvs_config local_340;
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  aStack_370.seqtree = (btree *)0x111f26;
  gettimeofday(&local_350,(__timezone_ptr_t)0x0);
  aStack_370.seqtree = (btree *)0x111f2b;
  memleak_start();
  aStack_370.seqtree = (btree *)0x111f3b;
  fdb_get_default_config();
  aStack_370.seqtree = (btree *)0x111f48;
  fdb_get_default_kvs_config();
  local_128.wal_threshold = 0x400;
  local_128.seqtree_opt = '\x01';
  local_128.flags = 1;
  aStack_370.seqtree = (btree *)0x111f67;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_370.seqtree = (btree *)0x111f7e;
  fdb_open((fdb_file_handle **)&local_358,"./iterator_test1",&local_128);
  aStack_370.seqtree = (btree *)0x111f95;
  fdb_kvs_open((fdb_file_handle *)local_358._M_i,(fdb_kvs_handle **)&local_360,"db1",&local_340);
  pcVar56 = local_328 + 0x100;
  aVar54.seqtree = (btree *)0x0;
  do {
    aStack_370.seqtree = (btree *)0x111fbe;
    sprintf(pcVar56,"key%d",aVar54.seqtree);
    aStack_370.seqtree = (btree *)0x111fcd;
    sprintf(local_328,"body%d",aVar54.seqtree);
    pcVar60 = (char *)local_360;
    aStack_370.seqtree = (btree *)0x111fda;
    _Var14._M_i = strlen(pcVar56);
    aStack_370.seqtree = (btree *)0x111fe5;
    sVar15 = strlen(local_328);
    aStack_370.seqtree = (btree *)0x111ff9;
    fdb_set_kv((fdb_kvs_handle *)pcVar60,pcVar56,_Var14._M_i,local_328,sVar15);
    aVar54._0_4_ = aVar54._0_4_ + 1;
    aVar54._4_4_ = 0;
  } while (aVar54._0_4_ != 10);
  aStack_370.seqtree = (btree *)0x112014;
  fVar12 = fdb_iterator_sequence_init
                     ((fdb_kvs_handle *)local_360,(fdb_iterator **)&local_368.seqtree,0,0,0);
  if (fVar12 == FDB_RESULT_SUCCESS) {
    _Var14._M_i = 10;
    do {
      aStack_370.seqtree = (btree *)0x11202a;
      fVar12 = fdb_iterator_next((fdb_iterator *)local_368.seqtree);
      uVar19 = (int)_Var14._M_i - 1;
      _Var14._M_i = (__int_type)uVar19;
    } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
    aStack_370.seqtree = (btree *)0x11203a;
    fdb_iterator_close((fdb_iterator *)local_368.seqtree);
    if (uVar19 != 0) goto LAB_0011215d;
    aStack_370.seqtree = (btree *)0x11204e;
    fdb_compact((fdb_file_handle *)local_358._M_i,(char *)0x0);
    pcVar56 = local_328 + 0x100;
    aVar54.seqtree = (btree *)0x0;
    do {
      aStack_370.seqtree = (btree *)0x112077;
      sprintf(pcVar56,"key%d",aVar54.seqtree);
      aStack_370.seqtree = (btree *)0x112086;
      sprintf(local_328,"body%d",aVar54.seqtree);
      pcVar60 = (char *)local_360;
      aStack_370.seqtree = (btree *)0x112093;
      _Var14._M_i = strlen(pcVar56);
      aStack_370.seqtree = (btree *)0x11209e;
      sVar15 = strlen(local_328);
      aStack_370.seqtree = (btree *)0x1120b2;
      fdb_set_kv((fdb_kvs_handle *)pcVar60,pcVar56,_Var14._M_i,local_328,sVar15);
      aVar54._0_4_ = aVar54._0_4_ + 1;
      aVar54._4_4_ = 0;
    } while (aVar54._0_4_ != 10);
    aStack_370.seqtree = (btree *)0x1120cd;
    fVar12 = fdb_iterator_sequence_init
                       ((fdb_kvs_handle *)local_360,(fdb_iterator **)&local_368.seqtree,0,0,0);
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00112162;
    _Var14._M_i = 10;
    do {
      aStack_370.seqtree = (btree *)0x1120e3;
      fVar12 = fdb_iterator_next((fdb_iterator *)local_368.seqtree);
      uVar19 = (int)_Var14._M_i - 1;
      _Var14._M_i = (__int_type)uVar19;
    } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
    aStack_370.seqtree = (btree *)0x1120f3;
    fdb_iterator_close((fdb_iterator *)local_368.seqtree);
    if (uVar19 == 0) {
      aStack_370.seqtree = (btree *)0x112101;
      fdb_kvs_close((fdb_kvs_handle *)local_360);
      aStack_370.seqtree = (btree *)0x11210b;
      fdb_close((fdb_file_handle *)local_358._M_i);
      aStack_370.seqtree = (btree *)0x112110;
      fdb_shutdown();
      aStack_370.seqtree = (btree *)0x112115;
      memleak_end();
      pcVar56 = "%s PASSED\n";
      if (iterator_compact_uncommitted_db()::__test_pass != '\0') {
        pcVar56 = "%s FAILED\n";
      }
      aStack_370.seqtree = (btree *)0x112146;
      fprintf(_stderr,pcVar56,"iterator compact uncommitted db");
      return;
    }
  }
  else {
    aStack_370.seqtree = (btree *)0x11215d;
    iterator_compact_uncommitted_db();
LAB_0011215d:
    aStack_370.seqtree = (btree *)0x112162;
    iterator_compact_uncommitted_db();
LAB_00112162:
    aStack_370.seqtree = (btree *)0x112167;
    iterator_compact_uncommitted_db();
  }
  _Var16._M_i = (__int_type)local_328;
  aStack_370.seqtree = (btree *)iterator_seek_test;
  iterator_compact_uncommitted_db();
  pcVar55 = (char *)&aStack_370;
  pcStack_378 = "body%d";
  puVar28 = auStack_840;
  puVar29 = auStack_840;
  puVar30 = auStack_840;
  puVar31 = auStack_840;
  puVar32 = auStack_840;
  puVar33 = auStack_840;
  puVar34 = auStack_840;
  puVar35 = auStack_840;
  puVar36 = auStack_840;
  puVar37 = auStack_840;
  puVar38 = auStack_840;
  puVar39 = auStack_840;
  puVar40 = auStack_840;
  puVar41 = auStack_840;
  puVar42 = auStack_840;
  puVar43 = auStack_840;
  puVar44 = auStack_840;
  puVar45 = auStack_840;
  puVar46 = auStack_840;
  puVar47 = auStack_840;
  puVar48 = auStack_840;
  puVar49 = auStack_840;
  puVar50 = auStack_840;
  puVar51 = auStack_840;
  puVar52 = auStack_840;
  pfVar53 = (fdb_kvs_handle *)auStack_840;
  _Var23._M_i = (__int_type)auStack_840;
  aStack_398.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var14._M_i;
  aStack_390.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
  aStack_380.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)((long)local_328 + 0x100);
  aStack_370 = aVar54;
  gettimeofday((timeval *)(aplStack_540 + 0x21),(__timezone_ptr_t)0x0);
  memleak_start();
  _Stack_3a0._M_i = 0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  _Var14._M_i = (__int_type)auStack_428;
  fdb_get_default_kvs_config();
  fStack_838.buffercache_size = 0;
  fStack_838.wal_threshold = 0x400;
  fStack_838.flags = 1;
  fStack_838.compaction_threshold = '\0';
  fStack_838.purging_interval = 1;
  pcVar56 = auStack_3b8;
  fdb_open((fdb_file_handle **)pcVar56,"./iterator_test1",&fStack_838);
  pfVar21 = (fdb_kvs_handle *)auStack_3b0;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_3b8,(fdb_kvs_handle **)pfVar21,(fdb_kvs_config *)_Var14._M_i
            );
  fVar12 = fdb_set_log_callback
                     ((fdb_kvs_handle *)auStack_3b0._0_8_,logCallbackFunc,"iterator_seek_test");
  pfVar27 = (fdb_kvs_handle *)auStack_840;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00113064;
  fVar12 = fdb_kvs_open((fdb_file_handle *)auStack_3b8,(fdb_kvs_handle **)&_Stack_3c0,"kv1",
                        (fdb_kvs_config *)auStack_428);
  puVar11 = auStack_840;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00113069;
  _Var20._M_i = 0;
  pcVar56 = (char *)0x0;
  do {
    pplVar2 = &abStack_740[4].alc_list.tail;
    sprintf((char *)pplVar2,"kEy%d",(ulong)pcVar56 & 0xffffffff);
    sprintf((char *)abStack_740,"mEta%d",(ulong)pcVar56 & 0xffffffff);
    sprintf((char *)&abStack_740[2].ndeltanodes,"bOdy%d",(ulong)pcVar56 & 0xffffffff);
    pcVar60 = (char *)((long)&it + (long)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->kvs_config);
    _Var14._M_i = strlen((char *)pplVar2);
    _Var16._M_i = strlen((char *)abStack_740);
    sVar15 = strlen((char *)&abStack_740[2].ndeltanodes);
    uStack_858 = 0x1122f0;
    fdb_doc_create((fdb_doc **)pcVar60,&abStack_740[4].alc_list.tail,_Var14._M_i,abStack_740,
                   _Var16._M_i,&abStack_740[2].ndeltanodes,sVar15);
    fVar12 = fdb_set((fdb_kvs_handle *)_Stack_3c0._M_i,
                     (fdb_doc *)
                     apbStack_408[(long)&((filemgr *)((long)pcVar56 + -0x2f0))->field_0x2ef]);
    if (fVar12 != FDB_RESULT_SUCCESS) {
      iterator_seek_test();
      goto LAB_00113013;
    }
    fdb_doc_free((fdb_doc *)apbStack_408[(long)&((filemgr *)((long)pcVar56 + -0x2f0))->field_0x2ef])
    ;
    pcVar56 = &((fdb_kvs_config *)&((filemgr *)pcVar56)->filename)->field_0x1;
    _Var20._M_i = (__int_type)&(((fdb_kvs_handle *)_Var20._M_i)->kvs_config).custom_cmp;
  } while (pcVar56 != (undefined1 *)0xa);
  lVar58 = 8;
  uVar24 = 1;
  do {
    pplVar2 = &abStack_740[4].alc_list.tail;
    sprintf((char *)pplVar2,"key%d",uVar24 & 0xffffffff);
    sprintf((char *)abStack_740,"meta%d",uVar24 & 0xffffffff);
    sprintf((char *)&abStack_740[2].ndeltanodes,"body%d",uVar24 & 0xffffffff);
    sVar15 = strlen((char *)pplVar2);
    sVar17 = strlen((char *)abStack_740);
    sVar18 = strlen((char *)&abStack_740[2].ndeltanodes);
    uStack_858 = 0x1123da;
    fdb_doc_create((fdb_doc **)(auStack_428 + lVar58 + 0x18),&abStack_740[4].alc_list.tail,sVar15,
                   abStack_740,sVar17,&abStack_740[2].ndeltanodes,sVar18);
    fdb_set((fdb_kvs_handle *)auStack_3b0._0_8_,(fdb_doc *)apbStack_408[uVar24 - 1]);
    lVar58 = lVar58 + 0x10;
    bVar64 = uVar24 < 8;
    uVar24 = uVar24 + 2;
  } while (bVar64);
  fdb_commit((fdb_file_handle *)auStack_3b8,'\x01');
  lVar58 = 0;
  uVar24 = 0;
  do {
    pplVar2 = &abStack_740[4].alc_list.tail;
    sprintf((char *)pplVar2,"key%d",uVar24 & 0xffffffff);
    sprintf((char *)abStack_740,"meta%d",uVar24 & 0xffffffff);
    sprintf((char *)&abStack_740[2].ndeltanodes,"body%d",uVar24 & 0xffffffff);
    pcVar60 = auStack_428 + lVar58 + 0x18;
    _Var14._M_i = strlen((char *)pplVar2);
    _Var16._M_i = strlen((char *)abStack_740);
    sVar15 = strlen((char *)&abStack_740[2].ndeltanodes);
    uStack_858 = 0x1124ba;
    fdb_doc_create((fdb_doc **)pcVar60,&abStack_740[4].alc_list.tail,_Var14._M_i,abStack_740,
                   _Var16._M_i,&abStack_740[2].ndeltanodes,sVar15);
    fdb_set((fdb_kvs_handle *)auStack_3b0._0_8_,(fdb_doc *)apbStack_408[uVar24 - 1]);
    pcVar56 = (char *)(uVar24 + 2);
    lVar58 = lVar58 + 0x10;
    bVar64 = uVar24 < 8;
    uVar24 = (ulong)pcVar56;
  } while (bVar64);
  fdb_commit((fdb_file_handle *)auStack_3b8,'\0');
  uStack_858 = 0x11250f;
  fdb_iterator_init((fdb_kvs_handle *)auStack_3b0._0_8_,(fdb_iterator **)(auStack_3b0 + 8),
                    (void *)0x0,0,(void *)0x0,0,0);
  fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var20._M_i = _Stack_3a0._M_i;
  pbVar59 = (btreeblk_handle *)auStack_428._24_8_;
  pfVar21 = (fdb_kvs_handle *)(auStack_3b0 + 8);
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011306e;
  _Var14._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar56 = (char *)((list *)(auStack_428._24_8_ + 0x18))->tail;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,*(size_t *)_Stack_3a0._M_i);
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_00113073;
  _Var14._M_i = *(__int_type *)(_Var20._M_i + 0x38);
  pcVar56 = *(char **)((long)pbVar59 + 0x38);
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8));
  if (iVar13 != 0) goto LAB_0011307e;
  _Var14._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
  pcVar56 = *(char **)((long)pbVar59 + 0x40);
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,
                (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var20._M_i + 0x10));
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_00113089;
  fdb_doc_free((fdb_doc *)_Var20._M_i);
  _Var20._M_i = auStack_3b0._8_8_;
  _Stack_3a0._M_i = 0;
  _Var14._M_i = (__int_type)(apbStack_408[1]->alc_list).tail;
  sVar15 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar12 = fdb_iterator_seek((fdb_iterator *)_Var20._M_i,(void *)_Var14._M_i,sVar15,'\0');
  if (fVar12 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113094;
  fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var16._M_i = _Stack_3a0._M_i;
  pbVar26 = apbStack_408[1];
  puVar11 = auStack_840;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00113099;
  _Var14._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar56 = (char *)(apbStack_408[1]->alc_list).tail;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,*(size_t *)_Stack_3a0._M_i);
  if (iVar13 != 0) goto LAB_0011309e;
  _Var14._M_i = *(__int_type *)(_Var16._M_i + 0x38);
  pcVar56 = (char *)pbVar26->file;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,(size_t)*(fdb_custom_cmp_variable *)(_Var16._M_i + 8));
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_001130a9;
  _Var14._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var16._M_i + 0x40))->seqtree;
  pcVar56 = (char *)pbVar26->log_callback;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,
                (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var16._M_i + 0x10));
  if (iVar13 != 0) goto LAB_001130b4;
  fdb_doc_free((fdb_doc *)_Var16._M_i);
  _Stack_3a0._M_i = 0;
  fVar12 = fdb_iterator_next((fdb_iterator *)auStack_3b0._8_8_);
  puVar11 = auStack_840;
  if (fVar12 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001130bf;
  fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var20._M_i = _Stack_3a0._M_i;
  pbVar59 = apbStack_408[2];
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001130c4;
  _Var14._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar56 = (char *)(apbStack_408[2]->alc_list).tail;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,*(size_t *)_Stack_3a0._M_i);
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_001130c9;
  _Var14._M_i = *(__int_type *)(_Var20._M_i + 0x38);
  pcVar56 = (char *)pbVar59->file;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8));
  if (iVar13 != 0) goto LAB_001130d4;
  _Var14._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
  pcVar56 = (char *)pbVar59->log_callback;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,
                (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var20._M_i + 0x10));
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_001130df;
  fdb_doc_free((fdb_doc *)_Var20._M_i);
  _Var20._M_i = auStack_3b0._8_8_;
  _Stack_3a0._M_i = 0;
  _Var14._M_i = (__int_type)(pbStack_3c8->alc_list).tail;
  sVar15 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar12 = fdb_iterator_seek((fdb_iterator *)_Var20._M_i,(void *)_Var14._M_i,sVar15,'\0');
  if (fVar12 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001130ea;
  fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var22._M_i = _Stack_3a0._M_i;
  pbVar26 = pbStack_3c8;
  puVar11 = auStack_840;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001130ef;
  _Var14._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar56 = (char *)(pbStack_3c8->alc_list).tail;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,*(size_t *)_Stack_3a0._M_i);
  if (iVar13 != 0) goto LAB_001130f4;
  _Var14._M_i = *(__int_type *)(_Var22._M_i + 0x38);
  pcVar56 = (char *)pbVar26->file;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,(size_t)*(fdb_custom_cmp_variable *)(_Var22._M_i + 8));
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_001130ff;
  _Var14._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var22._M_i + 0x40))->seqtree;
  pcVar56 = (char *)pbVar26->log_callback;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,
                (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var22._M_i + 0x10));
  if (iVar13 != 0) goto LAB_0011310a;
  fdb_doc_free((fdb_doc *)_Var22._M_i);
  _Var22._M_i = auStack_3b0._8_8_;
  _Stack_3a0._M_i = 0;
  _Var14._M_i = (__int_type)((list *)(auStack_428._24_8_ + 0x18))->tail;
  sVar15 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar12 = fdb_iterator_seek((fdb_iterator *)_Var22._M_i,(void *)_Var14._M_i,sVar15,'\0');
  puVar11 = auStack_840;
  if (fVar12 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113115;
  fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var20._M_i = _Stack_3a0._M_i;
  _Var16._M_i = auStack_428._24_8_;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011311a;
  _Var14._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar56 = (char *)((list *)(auStack_428._24_8_ + 0x18))->tail;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,*(size_t *)_Stack_3a0._M_i);
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_0011311f;
  _Var14._M_i = *(__int_type *)(_Var20._M_i + 0x38);
  pcVar56 = *(char **)(_Var16._M_i + 0x38);
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8));
  if (iVar13 != 0) goto LAB_0011312a;
  _Var14._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
  pcVar56 = *(char **)(_Var16._M_i + 0x40);
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,
                (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var20._M_i + 0x10));
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_00113135;
  fdb_doc_free((fdb_doc *)_Var20._M_i);
  _Var20._M_i = auStack_3b0._8_8_;
  _Stack_3a0._M_i = 0;
  _Var14._M_i = (__int_type)(apbStack_408[1]->alc_list).tail;
  sVar15 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar12 = fdb_iterator_seek((fdb_iterator *)_Var20._M_i,(void *)_Var14._M_i,sVar15,'\0');
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00113140;
  pcVar60 = (char *)0x2;
  _Var22._M_i = _Var14._M_i;
  do {
    fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
    _Var14._M_i = _Stack_3a0._M_i;
    pfVar21 = (fdb_kvs_handle *)_Var20._M_i;
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011301e;
    pcVar56 = *(char **)(_Stack_3a0._M_i + 0x20);
    _Var20._M_i = (__int_type)
                  apbStack_408[(long)&((filemgr *)((long)pcVar60 + -0x2f0))->field_0x2ef];
    _Var16._M_i = (__int_type)((fdb_kvs_handle *)_Var20._M_i)->op_stats;
    iVar13 = bcmp(pcVar56,(void *)_Var16._M_i,*(size_t *)_Stack_3a0._M_i);
    if (iVar13 != 0) goto LAB_00113013;
    pcVar56 = *(char **)(_Var14._M_i + 0x38);
    _Var16._M_i = (__int_type)((fdb_kvs_handle *)_Var20._M_i)->staletree;
    iVar13 = bcmp(pcVar56,(void *)_Var16._M_i,(size_t)*(fdb_custom_cmp_variable *)(_Var14._M_i + 8))
    ;
    pfVar21 = (fdb_kvs_handle *)_Var20._M_i;
    if (iVar13 != 0) goto LAB_0011302e;
    pcVar56 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var14._M_i + 0x40))->
                      seqtree;
    _Var16._M_i = (__int_type)(((fdb_kvs_handle *)_Var20._M_i)->field_6).seqtree;
    iVar13 = bcmp(pcVar56,(void *)_Var16._M_i,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var14._M_i + 0x10));
    if (iVar13 != 0) goto LAB_00113023;
    fdb_doc_free((fdb_doc *)_Var14._M_i);
    _Stack_3a0._M_i = 0;
    pcVar60 = &((fdb_kvs_config *)&((filemgr *)pcVar60)->filename)->field_0x1;
    fVar12 = fdb_iterator_next((fdb_iterator *)auStack_3b0._8_8_);
    pfVar21 = (fdb_kvs_handle *)auStack_3b0._8_8_;
    _Var22._M_i = _Var14._M_i;
  } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
  puVar11 = auStack_840;
  if ((uint8_t *)pcVar60 != (uint8_t *)0xa) goto LAB_00113145;
  _Var14._M_i = (__int_type)(apbStack_408[2]->alc_list).tail;
  sVar15 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar12 = fdb_iterator_seek((fdb_iterator *)pfVar21,(void *)_Var14._M_i,sVar15,'\0');
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011314a;
  pcVar60 = (char *)0x3;
  _Var20._M_i = _Var14._M_i;
  do {
    fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
    _Var14._M_i = _Stack_3a0._M_i;
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00113044;
    pcVar56 = *(char **)(_Stack_3a0._M_i + 0x20);
    pfVar21 = (fdb_kvs_handle *)
              apbStack_408[(long)&((filemgr *)((long)pcVar60 + -0x2f0))->field_0x2ef];
    _Var16._M_i = (__int_type)pfVar21->op_stats;
    iVar13 = bcmp(pcVar56,(void *)_Var16._M_i,*(size_t *)_Stack_3a0._M_i);
    if (iVar13 != 0) goto LAB_00113039;
    pcVar56 = *(char **)(_Var14._M_i + 0x38);
    _Var16._M_i = (__int_type)pfVar21->staletree;
    iVar13 = bcmp(pcVar56,(void *)_Var16._M_i,(size_t)*(fdb_custom_cmp_variable *)(_Var14._M_i + 8))
    ;
    if (iVar13 != 0) goto LAB_00113054;
    pcVar56 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var14._M_i + 0x40))->
                      seqtree;
    _Var16._M_i = (__int_type)(pfVar21->field_6).seqtree;
    iVar13 = bcmp(pcVar56,(void *)_Var16._M_i,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var14._M_i + 0x10));
    if (iVar13 != 0) goto LAB_00113049;
    fdb_doc_free((fdb_doc *)_Var14._M_i);
    _Stack_3a0._M_i = 0;
    pcVar60 = &((fdb_kvs_config *)&((filemgr *)pcVar60)->filename)->field_0x1;
    fVar12 = fdb_iterator_next((fdb_iterator *)auStack_3b0._8_8_);
    _Var20._M_i = _Var14._M_i;
  } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
  puVar11 = auStack_840;
  if ((uint8_t *)pcVar60 != (uint8_t *)0xa) goto LAB_0011314f;
  pfVar21 = (fdb_kvs_handle *)(auStack_3b0 + 8);
  fdb_iterator_close((fdb_iterator *)auStack_3b0._8_8_);
  _Var14._M_i = (__int_type)&abStack_740[4].alc_list.tail;
  sprintf((char *)_Var14._M_i,"key%d",4);
  _Var16._M_i = (__int_type)abStack_740;
  sprintf((char *)_Var16._M_i,"key%d",8);
  pcVar56 = (char *)auStack_3b0._0_8_;
  pcVar60 = (char *)strlen((char *)_Var14._M_i);
  sVar15 = strlen((char *)_Var16._M_i);
  uStack_858 = 0x112ac8;
  fVar12 = fdb_iterator_init((fdb_kvs_handle *)pcVar56,(fdb_iterator **)pfVar21,(void *)_Var14._M_i,
                             (size_t)pcVar60,(void *)_Var16._M_i,sVar15,2);
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00113154;
  fVar12 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_3b0._8_8_);
  puVar11 = auStack_840;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00113159;
  fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var23._M_i = _Stack_3a0._M_i;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011315e;
  _Var14._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar56 = (char *)(pbStack_3d0->alc_list).tail;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,*(size_t *)_Stack_3a0._M_i);
  puVar11 = auStack_840;
  _Var16._M_i = (__int_type)pbStack_3d0;
  if (iVar13 != 0) goto LAB_00113163;
  _Var14._M_i = *(__int_type *)(_Var23._M_i + 0x38);
  pcVar56 = (char *)pbStack_3d0->file;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,(size_t)*(fdb_custom_cmp_variable *)(_Var23._M_i + 8));
  if (iVar13 != 0) goto LAB_0011316e;
  _Var14._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var23._M_i + 0x40))->seqtree;
  pcVar56 = (char *)pbStack_3d0->log_callback;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,
                (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var23._M_i + 0x10));
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_00113179;
  fdb_doc_free((fdb_doc *)_Var23._M_i);
  _Stack_3a0._M_i = 0;
  fVar12 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_3b0._8_8_);
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00113184;
  fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var20._M_i = _Stack_3a0._M_i;
  puVar11 = auStack_840;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00113189;
  _Var14._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar56 = (char *)(apbStack_408[3]->alc_list).tail;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,*(size_t *)_Stack_3a0._M_i);
  _Var16._M_i = (__int_type)apbStack_408[3];
  if (iVar13 != 0) goto LAB_0011318e;
  _Var14._M_i = *(__int_type *)(_Var20._M_i + 0x38);
  pcVar56 = (char *)apbStack_408[3]->file;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8));
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_00113199;
  _Var14._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
  pcVar56 = (char *)apbStack_408[3]->log_callback;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,
                (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var20._M_i + 0x10));
  if (iVar13 != 0) goto LAB_001131a4;
  fdb_doc_free((fdb_doc *)_Var20._M_i);
  _Stack_3a0._M_i = 0;
  fVar12 = fdb_iterator_close((fdb_iterator *)auStack_3b0._8_8_);
  puVar11 = auStack_840;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001131af;
  uStack_858 = 0x112c3c;
  fVar12 = fdb_iterator_init((fdb_kvs_handle *)auStack_3b0._0_8_,(fdb_iterator **)(auStack_3b0 + 8),
                             (void *)0x0,0,(void *)0x0,0,0);
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001131b4;
  fVar12 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_3b0._8_8_);
  puVar11 = auStack_840;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001131b9;
  fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var16._M_i = _Stack_3a0._M_i;
  doc_01 = (char *)pbStack_3c8;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001131be;
  _Var14._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar56 = (char *)(pbStack_3c8->alc_list).tail;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,*(size_t *)_Stack_3a0._M_i);
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_001131c3;
  _Var14._M_i = *(__int_type *)(_Var16._M_i + 0x38);
  pcVar56 = (char *)((btreeblk_handle *)doc_01)->file;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,(size_t)*(fdb_custom_cmp_variable *)(_Var16._M_i + 8));
  if (iVar13 != 0) goto LAB_001131ce;
  _Var14._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var16._M_i + 0x40))->seqtree;
  pcVar56 = (char *)((btreeblk_handle *)doc_01)->log_callback;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,
                (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var16._M_i + 0x10));
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_001131d9;
  fdb_doc_free((fdb_doc *)_Var16._M_i);
  _Stack_3a0._M_i = 0;
  fVar12 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_3b0._8_8_);
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001131e4;
  fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var23._M_i = _Stack_3a0._M_i;
  puVar11 = auStack_840;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001131e9;
  _Var14._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar56 = (char *)((list *)(auStack_428._24_8_ + 0x18))->tail;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,*(size_t *)_Stack_3a0._M_i);
  doc_01 = (char *)auStack_428._24_8_;
  if (iVar13 != 0) goto LAB_001131ee;
  _Var14._M_i = *(__int_type *)(_Var23._M_i + 0x38);
  pcVar56 = *(char **)(auStack_428._24_8_ + 0x38);
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,(size_t)*(fdb_custom_cmp_variable *)(_Var23._M_i + 8));
  puVar11 = auStack_840;
  if (iVar13 != 0) goto LAB_001131f9;
  _Var14._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var23._M_i + 0x40))->seqtree;
  pcVar56 = *(char **)(auStack_428._24_8_ + 0x40);
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,
                (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var23._M_i + 0x10));
  if (iVar13 != 0) goto LAB_00113204;
  fdb_doc_free((fdb_doc *)_Var23._M_i);
  _Stack_3a0._M_i = 0;
  _Var23._M_i = (__int_type)afStack_107c0;
  memset((void *)_Var23._M_i,0xff,0xff80);
  fVar12 = fdb_iterator_seek((fdb_iterator *)auStack_3b0._8_8_,(void *)_Var23._M_i,0xff80,'\x01');
  pfVar53 = (fdb_kvs_handle *)_Var23._M_i;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011320f;
  fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var16._M_i = _Stack_3a0._M_i;
  pfVar21 = (fdb_kvs_handle *)_Var23._M_i;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00113214;
  _Var14._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar56 = (char *)(pbStack_3c8->alc_list).tail;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,*(size_t *)_Stack_3a0._M_i);
  doc_01 = (char *)pbStack_3c8;
  if (iVar13 != 0) goto LAB_00113219;
  _Var14._M_i = *(__int_type *)(_Var16._M_i + 0x38);
  pcVar56 = (char *)pbStack_3c8->file;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,(size_t)*(fdb_custom_cmp_variable *)(_Var16._M_i + 8));
  if (iVar13 != 0) goto LAB_00113224;
  _Var14._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var16._M_i + 0x40))->seqtree;
  pcVar56 = (char *)pbStack_3c8->log_callback;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,
                (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var16._M_i + 0x10));
  if (iVar13 != 0) goto LAB_0011322f;
  fdb_doc_free((fdb_doc *)_Var16._M_i);
  _Stack_3a0._M_i = 0;
  fVar12 = fdb_iterator_close((fdb_iterator *)auStack_3b0._8_8_);
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011323a;
  pfVar21 = (fdb_kvs_handle *)0xfffffffffffffffe;
  do {
    fVar12 = fdb_del((fdb_kvs_handle *)auStack_3b0._0_8_,
                     (fdb_doc *)apbStack_408[(long)&(pfVar21->kvs_config).field_0x1]);
    _Var16._M_i = (__int_type)pbStack_3c8;
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011305f;
    pfVar21 = (fdb_kvs_handle *)&(pfVar21->kvs_config).field_0x2;
  } while (pfVar21 < (undefined1 *)0x8);
  fdb_commit((fdb_file_handle *)auStack_3b8,'\0');
  fdb_iterator_init((fdb_kvs_handle *)auStack_3b0._0_8_,(fdb_iterator **)(auStack_3b0 + 8),
                    (void *)0x0,0,(void *)0x0,0,0);
  _Var16._M_i = auStack_3b0._8_8_;
  _Stack_3a0._M_i = 0;
  _Var14._M_i = (__int_type)(apbStack_408[1]->alc_list).tail;
  sVar15 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar12 = fdb_iterator_seek((fdb_iterator *)_Var16._M_i,(void *)_Var14._M_i,sVar15,'\0');
  if (fVar12 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011323f;
  fVar12 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var20._M_i = _Stack_3a0._M_i;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00113244;
  _Var14._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar56 = (char *)(apbStack_408[1]->alc_list).tail;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,*(size_t *)_Stack_3a0._M_i);
  doc_01 = (char *)apbStack_408[1];
  if (iVar13 != 0) goto LAB_00113249;
  _Var14._M_i = *(__int_type *)(_Var20._M_i + 0x38);
  pcVar56 = (char *)apbStack_408[1]->file;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8));
  if (iVar13 != 0) goto LAB_00113254;
  _Var14._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
  pcVar56 = (char *)apbStack_408[1]->log_callback;
  pfVar57 = (filemgr *)pcVar56;
  iVar13 = bcmp((void *)_Var14._M_i,pcVar56,
                (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var20._M_i + 0x10));
  uVar65 = SUB84(pfVar57,0);
  if (iVar13 != 0) goto LAB_0011325f;
  fdb_doc_free((fdb_doc *)_Var20._M_i);
  _Stack_3a0._M_i = 0;
  fVar12 = fdb_iterator_close((fdb_iterator *)auStack_3b0._8_8_);
  uVar19 = (uint)auStack_3b0._8_8_;
  if (fVar12 == FDB_RESULT_SUCCESS) {
    fdb_kvs_close((fdb_kvs_handle *)_Stack_3c0._M_i);
    fdb_kvs_close((fdb_kvs_handle *)auStack_3b0._0_8_);
    fdb_close((fdb_file_handle *)auStack_3b8);
    lVar58 = 0;
    do {
      fdb_doc_free((fdb_doc *)apbStack_408[lVar58 + -1]);
      lVar58 = lVar58 + 1;
    } while (lVar58 != 10);
    fdb_shutdown();
    memleak_end();
    pcVar56 = "%s PASSED\n";
    if (iterator_seek_test()::__test_pass != '\0') {
      pcVar56 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar56,"iterator seek test");
    return;
  }
  goto LAB_0011326a;
LAB_00114f8a:
  fconfig_00 = (char *)(ulong)uVar19;
  pcVar56 = "key%06d";
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f9a;
  iterator_complete_test();
LAB_00114f9a:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114faa;
  iterator_complete_test();
LAB_00114faa:
  doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
  pcVar55 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fba;
  iterator_complete_test();
LAB_00114fba:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fca;
  iterator_complete_test();
LAB_00114fca:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fda;
  iterator_complete_test();
LAB_00114fda:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fea;
  iterator_complete_test();
LAB_00114fea:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ffa;
  iterator_complete_test();
LAB_00114ffa:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fff;
  iterator_complete_test();
LAB_00114fff:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115004;
  iterator_complete_test();
LAB_00115004:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115009;
  iterator_complete_test();
LAB_00115009:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11500e;
  iterator_complete_test();
LAB_0011500e:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115013;
  iterator_complete_test();
LAB_00115013:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115018;
  iterator_complete_test();
LAB_00115018:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11501d;
  iterator_complete_test();
LAB_0011501d:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115022;
  iterator_complete_test();
LAB_00115022:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115027;
  iterator_complete_test();
LAB_00115027:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11502c;
  iterator_complete_test();
LAB_0011502c:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115031;
  iterator_complete_test();
LAB_00115031:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115036;
  iterator_complete_test();
LAB_00115036:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11503b;
  iterator_complete_test();
LAB_0011503b:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115040;
  iterator_complete_test();
LAB_00115040:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115050;
  iterator_complete_test();
LAB_00115050:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115060;
  iterator_complete_test();
LAB_00115060:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115070;
  iterator_complete_test();
LAB_00115070:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115080;
  iterator_complete_test();
  pfVar57 = (filemgr *)pcVar60;
LAB_00115080:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115085;
  iterator_complete_test();
LAB_00115085:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11508a;
  iterator_complete_test();
  pfVar61 = pfVar57;
LAB_0011508a:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11508f;
  iterator_complete_test();
  pfVar57 = pfVar61;
LAB_0011508f:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115094;
  iterator_complete_test();
LAB_00115094:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115099;
  iterator_complete_test();
  pfVar53 = pfVar21;
LAB_00115099:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11509e;
  iterator_complete_test();
LAB_0011509e:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150a3;
  iterator_complete_test();
LAB_001150a3:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150a8;
  iterator_complete_test();
  pcVar60 = (char *)pfVar57;
  pfVar21 = pfVar53;
LAB_001150a8:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150ad;
  iterator_complete_test();
LAB_001150ad:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150b2;
  iterator_complete_test();
  goto LAB_001150b2;
LAB_00115614:
  (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115621;
  iterator_extreme_key_test();
LAB_00115621:
  (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11562e;
  iterator_extreme_key_test();
LAB_0011562e:
  pfVar21 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
  pcVar56 = "0xff length %d";
  doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask;
  (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11563b;
  pfVar53 = (fdb_kvs_handle *)doc_01;
  iterator_extreme_key_test();
  goto LAB_0011563b;
LAB_00113013:
  iterator_seek_test();
  pfVar21 = (fdb_kvs_handle *)_Var20._M_i;
  _Var22._M_i = _Var14._M_i;
LAB_0011301e:
  _Var14._M_i = _Var22._M_i;
  iterator_seek_test();
LAB_00113023:
  iterator_seek_test();
LAB_0011302e:
  iterator_seek_test();
LAB_00113039:
  iterator_seek_test();
  _Var20._M_i = _Var14._M_i;
LAB_00113044:
  _Var14._M_i = _Var20._M_i;
  iterator_seek_test();
LAB_00113049:
  iterator_seek_test();
LAB_00113054:
  iterator_seek_test();
LAB_0011305f:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113064;
  iterator_seek_test();
  pfVar27 = (fdb_kvs_handle *)_Var23._M_i;
LAB_00113064:
  *(undefined8 *)((long)pfVar27 + -8) = 0x113069;
  iterator_seek_test();
  puVar11 = (undefined1 *)pfVar27;
LAB_00113069:
  puVar28 = puVar11;
  *(undefined8 *)(puVar28 + -8) = 0x11306e;
  iterator_seek_test();
LAB_0011306e:
  pbVar59 = (btreeblk_handle *)_Var16._M_i;
  _Var20._M_i = (__int_type)pfVar21;
  *(undefined8 *)(puVar28 + -8) = 0x113073;
  iterator_seek_test();
  puVar11 = puVar28;
LAB_00113073:
  puVar29 = puVar11;
  *(undefined8 *)(puVar29 + -8) = 0x11307e;
  iterator_seek_test();
LAB_0011307e:
  *(undefined8 *)(puVar29 + -8) = 0x113089;
  iterator_seek_test();
  puVar11 = puVar29;
LAB_00113089:
  puVar30 = puVar11;
  *(undefined8 *)(puVar30 + -8) = 0x113094;
  iterator_seek_test();
LAB_00113094:
  *(undefined8 *)(puVar30 + -8) = 0x113099;
  iterator_seek_test();
  puVar11 = puVar30;
LAB_00113099:
  pbVar26 = pbVar59;
  puVar31 = puVar11;
  _Var16._M_i = _Var20._M_i;
  *(undefined8 *)(puVar31 + -8) = 0x11309e;
  iterator_seek_test();
LAB_0011309e:
  *(undefined8 *)(puVar31 + -8) = 0x1130a9;
  iterator_seek_test();
  puVar11 = puVar31;
LAB_001130a9:
  puVar32 = puVar11;
  *(undefined8 *)(puVar32 + -8) = 0x1130b4;
  iterator_seek_test();
LAB_001130b4:
  *(undefined8 *)(puVar32 + -8) = 0x1130bf;
  iterator_seek_test();
  puVar11 = puVar32;
LAB_001130bf:
  puVar33 = puVar11;
  *(undefined8 *)(puVar33 + -8) = 0x1130c4;
  iterator_seek_test();
LAB_001130c4:
  pbVar59 = pbVar26;
  _Var20._M_i = _Var16._M_i;
  *(undefined8 *)(puVar33 + -8) = 0x1130c9;
  iterator_seek_test();
  puVar11 = puVar33;
LAB_001130c9:
  puVar34 = puVar11;
  *(undefined8 *)(puVar34 + -8) = 0x1130d4;
  iterator_seek_test();
LAB_001130d4:
  *(undefined8 *)(puVar34 + -8) = 0x1130df;
  iterator_seek_test();
  puVar11 = puVar34;
LAB_001130df:
  puVar35 = puVar11;
  *(undefined8 *)(puVar35 + -8) = 0x1130ea;
  iterator_seek_test();
LAB_001130ea:
  *(undefined8 *)(puVar35 + -8) = 0x1130ef;
  iterator_seek_test();
  puVar11 = puVar35;
LAB_001130ef:
  pbVar26 = pbVar59;
  puVar36 = puVar11;
  _Var22._M_i = _Var20._M_i;
  *(undefined8 *)(puVar36 + -8) = 0x1130f4;
  iterator_seek_test();
LAB_001130f4:
  *(undefined8 *)(puVar36 + -8) = 0x1130ff;
  iterator_seek_test();
  puVar11 = puVar36;
LAB_001130ff:
  puVar37 = puVar11;
  *(undefined8 *)(puVar37 + -8) = 0x11310a;
  iterator_seek_test();
LAB_0011310a:
  *(undefined8 *)(puVar37 + -8) = 0x113115;
  iterator_seek_test();
  puVar11 = puVar37;
LAB_00113115:
  puVar38 = puVar11;
  *(undefined8 *)(puVar38 + -8) = 0x11311a;
  iterator_seek_test();
LAB_0011311a:
  _Var16._M_i = (__int_type)pbVar26;
  _Var20._M_i = _Var22._M_i;
  *(undefined8 *)(puVar38 + -8) = 0x11311f;
  iterator_seek_test();
  puVar11 = puVar38;
LAB_0011311f:
  puVar39 = puVar11;
  *(undefined8 *)(puVar39 + -8) = 0x11312a;
  iterator_seek_test();
LAB_0011312a:
  *(undefined8 *)(puVar39 + -8) = 0x113135;
  iterator_seek_test();
  puVar11 = puVar39;
LAB_00113135:
  puVar40 = puVar11;
  *(undefined8 *)(puVar40 + -8) = 0x113140;
  iterator_seek_test();
LAB_00113140:
  *(undefined8 *)(puVar40 + -8) = 0x113145;
  iterator_seek_test();
  puVar11 = puVar40;
LAB_00113145:
  puVar41 = puVar11;
  pfVar21 = (fdb_kvs_handle *)_Var20._M_i;
  *(undefined8 *)(puVar41 + -8) = 0x11314a;
  iterator_seek_test();
LAB_0011314a:
  *(undefined8 *)(puVar41 + -8) = 0x11314f;
  iterator_seek_test();
  puVar11 = puVar41;
LAB_0011314f:
  puVar42 = puVar11;
  *(undefined8 *)(puVar42 + -8) = 0x113154;
  iterator_seek_test();
LAB_00113154:
  *(undefined8 *)(puVar42 + -8) = 0x113159;
  iterator_seek_test();
  puVar11 = puVar42;
LAB_00113159:
  puVar43 = puVar11;
  *(undefined8 *)(puVar43 + -8) = 0x11315e;
  iterator_seek_test();
LAB_0011315e:
  _Var23._M_i = (__int_type)pfVar21;
  *(undefined8 *)(puVar43 + -8) = 0x113163;
  iterator_seek_test();
  puVar11 = puVar43;
LAB_00113163:
  puVar44 = puVar11;
  *(undefined8 *)(puVar44 + -8) = 0x11316e;
  iterator_seek_test();
LAB_0011316e:
  *(undefined8 *)(puVar44 + -8) = 0x113179;
  iterator_seek_test();
  puVar11 = puVar44;
LAB_00113179:
  puVar45 = puVar11;
  *(undefined8 *)(puVar45 + -8) = 0x113184;
  iterator_seek_test();
LAB_00113184:
  *(undefined8 *)(puVar45 + -8) = 0x113189;
  iterator_seek_test();
  puVar11 = puVar45;
LAB_00113189:
  puVar46 = puVar11;
  _Var20._M_i = _Var23._M_i;
  *(undefined8 *)(puVar46 + -8) = 0x11318e;
  iterator_seek_test();
LAB_0011318e:
  *(undefined8 *)(puVar46 + -8) = 0x113199;
  iterator_seek_test();
  puVar11 = puVar46;
LAB_00113199:
  puVar47 = puVar11;
  *(undefined8 *)(puVar47 + -8) = 0x1131a4;
  iterator_seek_test();
LAB_001131a4:
  *(undefined8 *)(puVar47 + -8) = 0x1131af;
  iterator_seek_test();
  puVar11 = puVar47;
LAB_001131af:
  puVar48 = puVar11;
  *(undefined8 *)(puVar48 + -8) = 0x1131b4;
  iterator_seek_test();
LAB_001131b4:
  *(undefined8 *)(puVar48 + -8) = 0x1131b9;
  iterator_seek_test();
  puVar11 = puVar48;
LAB_001131b9:
  puVar49 = puVar11;
  *(undefined8 *)(puVar49 + -8) = 0x1131be;
  iterator_seek_test();
  apbStack_408[3] = (btreeblk_handle *)_Var16._M_i;
LAB_001131be:
  doc_01 = (char *)apbStack_408[3];
  _Var16._M_i = _Var20._M_i;
  *(undefined8 *)(puVar49 + -8) = 0x1131c3;
  iterator_seek_test();
  puVar11 = puVar49;
LAB_001131c3:
  puVar50 = puVar11;
  *(undefined8 *)(puVar50 + -8) = 0x1131ce;
  iterator_seek_test();
LAB_001131ce:
  *(undefined8 *)(puVar50 + -8) = 0x1131d9;
  iterator_seek_test();
  puVar11 = puVar50;
LAB_001131d9:
  puVar51 = puVar11;
  *(undefined8 *)(puVar51 + -8) = 0x1131e4;
  iterator_seek_test();
LAB_001131e4:
  *(undefined8 *)(puVar51 + -8) = 0x1131e9;
  iterator_seek_test();
  puVar11 = puVar51;
LAB_001131e9:
  puVar52 = puVar11;
  _Var23._M_i = _Var16._M_i;
  *(undefined8 *)(puVar52 + -8) = 0x1131ee;
  iterator_seek_test();
LAB_001131ee:
  *(undefined8 *)(puVar52 + -8) = 0x1131f9;
  iterator_seek_test();
  puVar11 = puVar52;
LAB_001131f9:
  pfVar53 = (fdb_kvs_handle *)puVar11;
  *(undefined8 *)((long)pfVar53 + -8) = 0x113204;
  iterator_seek_test();
LAB_00113204:
  *(undefined8 *)((long)pfVar53 + -8) = 0x11320f;
  iterator_seek_test();
LAB_0011320f:
  pfVar53[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113214;
  iterator_seek_test();
  pfVar21 = (fdb_kvs_handle *)_Var23._M_i;
  _Var23._M_i = (__int_type)pfVar53;
LAB_00113214:
  _Var16._M_i = (__int_type)pfVar21;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113219;
  iterator_seek_test();
LAB_00113219:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113224;
  iterator_seek_test();
LAB_00113224:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11322f;
  iterator_seek_test();
LAB_0011322f:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11323a;
  iterator_seek_test();
LAB_0011323a:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11323f;
  iterator_seek_test();
LAB_0011323f:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113244;
  iterator_seek_test();
LAB_00113244:
  _Var20._M_i = _Var16._M_i;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113249;
  iterator_seek_test();
LAB_00113249:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113254;
  iterator_seek_test();
LAB_00113254:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11325f;
  iterator_seek_test();
LAB_0011325f:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11326a;
  pfVar21 = (fdb_kvs_handle *)_Var14._M_i;
  pfVar57 = (filemgr *)pcVar56;
  iterator_seek_test();
  uVar19 = (uint)pfVar57;
  uVar65 = SUB84(pfVar21,0);
LAB_0011326a:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle =
       (fdb_kvs_handle *)iterator_complete_test;
  iterator_seek_test();
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)&aStack_370;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).space_used = (uint64_t)pcVar56;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).num_entries = _Var14._M_i;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).entries = (list *)pcVar60;
  *(char **)&((fdb_kvs_handle *)(_Var23._M_i + -0x208))->num_iterators = doc_01;
  ((fdb_kvs_handle *)(_Var23._M_i + -0x208))->node = (kvs_opened_node *)_Var20._M_i;
  *(undefined4 *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
       = uVar65;
  pfVar21 = (fdb_kvs_handle *)(ulong)uVar19;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113296;
  gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x208))->config).compaction_cb_mask,
               (__timezone_ptr_t)0x0);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
  ((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node = (kvs_opened_node *)0x202066722d206d72;
  *(undefined8 *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->num_iterators = 0x726f746172657469;
  *(undefined8 *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->field_0x1e7 = 0x2a747365745f72;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1132c4;
  system((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1132c9;
  memleak_start();
  fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x208))->config).max_writer_lock_prob;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1132d9;
  fdb_get_default_config();
  *(undefined4 *)
   ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x208))->config).num_bgflusher_threads + 4) = 1;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1132ed;
  fdb_get_default_kvs_config();
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113301;
  fVar12 = fdb_open((fdb_file_handle **)
                    ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4),
                    "./iterator_test",(fdb_config *)fconfig_00);
  if (fVar12 != FDB_RESULT_SUCCESS) {
LAB_001150b7:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150bc;
    iterator_complete_test();
LAB_001150bc:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150c1;
    iterator_complete_test();
LAB_001150c1:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150c6;
    iterator_complete_test();
LAB_001150c6:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150cb;
    iterator_complete_test();
LAB_001150cb:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150d0;
    iterator_complete_test();
LAB_001150d0:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150d5;
    iterator_complete_test();
LAB_001150d5:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150da;
    iterator_complete_test();
LAB_001150da:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150df;
    iterator_complete_test();
LAB_001150df:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150e4;
    iterator_complete_test();
LAB_001150e4:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150e9;
    iterator_complete_test();
LAB_001150e9:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150ee;
    iterator_complete_test();
LAB_001150ee:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150f3;
    iterator_complete_test();
LAB_001150f3:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150f8;
    iterator_complete_test();
LAB_001150f8:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150fd;
    iterator_complete_test();
LAB_001150fd:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115102;
    iterator_complete_test();
LAB_00115102:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115107;
    iterator_complete_test();
LAB_00115107:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11510c;
    iterator_complete_test();
LAB_0011510c:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115111;
    iterator_complete_test();
LAB_00115111:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115121;
    iterator_complete_test();
LAB_00115121:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115126;
    iterator_complete_test();
LAB_00115126:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11512b;
    iterator_complete_test();
LAB_0011512b:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115130;
    iterator_complete_test();
LAB_00115130:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115135;
    iterator_complete_test();
LAB_00115135:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115145;
    iterator_complete_test();
LAB_00115145:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11514a;
    iterator_complete_test();
LAB_0011514a:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11514f;
    iterator_complete_test();
LAB_0011514f:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115154;
    iterator_complete_test();
    pfVar57 = (filemgr *)pcVar60;
LAB_00115154:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115159;
    iterator_complete_test();
LAB_00115159:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11515e;
    iterator_complete_test();
LAB_0011515e:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115163;
    iterator_complete_test();
LAB_00115163:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115168;
    iterator_complete_test();
LAB_00115168:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11516d;
    iterator_complete_test();
LAB_0011516d:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115172;
    iterator_complete_test();
LAB_00115172:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115177;
    iterator_complete_test();
    pfVar53 = pfVar21;
LAB_00115177:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11517c;
    iterator_complete_test();
LAB_0011517c:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115181;
    iterator_complete_test();
    pfVar21 = pfVar53;
LAB_00115181:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115186;
    iterator_complete_test();
LAB_00115186:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11518b;
    iterator_complete_test();
LAB_0011518b:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115190;
    iterator_complete_test();
LAB_00115190:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115195;
    iterator_complete_test();
LAB_00115195:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11519a;
    iterator_complete_test();
LAB_0011519a:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11519f;
    iterator_complete_test();
LAB_0011519f:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151a4;
    iterator_complete_test();
LAB_001151a4:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
         iterator_extreme_key_test;
    iterator_complete_test();
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = pcVar56;
    *(fdb_kvs_handle **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_mask =
         pfVar21;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb =
         (fdb_compaction_callback)pfVar57;
    *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_wal_partitions = doc_01;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).prefetch_duration = (uint64_t)fconfig_00;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1151c5;
    gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).num_wal_partitions
                 ,(__timezone_ptr_t)0x0);
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt = '\0';
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).durability_opt = '\0';
    *(undefined2 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).field_0x22 = 0;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).flags = 0;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x820))->filename = (char *)0x202066722d206d72;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x820))->txn = (fdb_txn *)0x726f746172657469;
    *(undefined8 *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x820))->txn + 7) = 0x2a747365745f72;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1151f3;
    system((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x820))->filename);
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1151f8;
    memleak_start();
    fconfig_01 = (atomic<unsigned_char> *)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xa28))->config).compaction_cb_mask;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115208;
    fdb_get_default_config();
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115212;
    fdb_get_default_kvs_config();
    pfVar53 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_minimum_filesize;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115226;
    fVar12 = fdb_open((fdb_file_handle **)pfVar53,"./iterator_test",(fdb_config *)fconfig_01);
    if (fVar12 == FDB_RESULT_SUCCESS) {
      pfVar53 = (fdb_kvs_handle *)
                (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115244;
      fVar12 = fdb_kvs_open((fdb_file_handle *)pfVar53,
                            (fdb_kvs_handle **)
                            &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                             compaction_buf_maxsize,(char *)0x0,
                            (fdb_kvs_config *)
                            &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                             compactor_sleep_duration);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115640;
      fconfig_01 = &((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->handle_busy;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115266;
      memset(fconfig_01,0xff,0x100);
      uVar24 = 1;
      pcVar56 = "0xff length %d";
      doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask;
      do {
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115288;
        sprintf(doc_01,"0xff length %d",uVar24 & 0xffffffff);
        pfVar57 = *(filemgr **)
                   &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_buf_maxsize;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115295;
        sVar15 = strlen(doc_01);
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1152aa;
        fdb_set_kv((fdb_kvs_handle *)pfVar57,fconfig_01,uVar24,doc_01,sVar15 + 1);
        uVar24 = uVar24 + 1;
      } while (uVar24 != 0x1e);
      pfVar3 = (fdb_file_handle *)
               (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1152c2;
      fdb_commit(pfVar3,'\x01');
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold = 0;
      pfVar53 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1152e0;
      fVar12 = fdb_doc_create((fdb_doc **)pfVar53,(void *)0x0,0,(void *)0x0,0,(void *)0x0,
                              (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold);
      pfVar21 = (fdb_kvs_handle *)0x1e;
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115645;
      lVar58 = *(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
      *(uint16_t **)(lVar58 + 0x20) =
           &(((fdb_kvs_handle *)(_Var23._M_i + -0x820))->config).num_wal_partitions;
      *(undefined8 *)(lVar58 + 0x38) = 0;
      *(fdb_txn ***)(lVar58 + 0x40) = &((fdb_kvs_handle *)(_Var23._M_i + -0xa28))->txn;
      pfVar53 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_buf_maxsize;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold = 0;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11532d;
      fVar12 = fdb_iterator_init(pfVar53,(fdb_iterator **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                          wal_flush_before_commit,(void *)0x0,0,(void *)0x0,0,
                                 (fdb_iterator_opt_t)
                                 (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold)
      ;
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011564a;
      pfVar53 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11533f;
      fVar12 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar53);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011564f;
      fconfig_01 = (atomic<unsigned_char> *)0x1d;
      do {
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11536a;
        fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                          seqtree_opt);
        if (fVar12 != FDB_RESULT_SUCCESS) break;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11537d;
        sprintf((char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask,
                "0xff length %d",fconfig_01);
        sVar15 = *(size_t *)
                  (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt + 0x10
                  );
        pfVar57 = *(filemgr **)
                   (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                   0x40);
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115395;
        iVar13 = bcmp(pfVar57,&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                               compaction_cb_mask,sVar15);
        if (iVar13 != 0) {
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115614;
          iterator_extreme_key_test();
          goto LAB_00115614;
        }
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1153a7;
        fVar12 = fdb_iterator_prev(pfVar4);
        fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 - 1);
      } while (fVar12 == FDB_RESULT_SUCCESS);
      pfVar4 = *(fdb_iterator **)
                &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1153c9;
      fVar12 = fdb_iterator_seek(pfVar4,&((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->handle_busy,8,
                                 '\x01');
      if (fVar12 == FDB_RESULT_SUCCESS) {
        fconfig_01 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1153f0;
          fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                            seqtree_opt);
          if (fVar12 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115403;
          sprintf((char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask,
                  "0xff length %d",fconfig_01);
          sVar15 = *(size_t *)
                    (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                    0x10);
          pfVar57 = *(filemgr **)
                     (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                     0x40);
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11541b;
          iVar13 = bcmp(pfVar57,&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                 compaction_cb_mask,sVar15);
          if (iVar13 != 0) goto LAB_00115621;
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11542d;
          fVar12 = fdb_iterator_prev(pfVar4);
          fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 - 1);
        } while (fVar12 == FDB_RESULT_SUCCESS);
      }
      pfVar4 = *(fdb_iterator **)
                &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11544f;
      fVar12 = fdb_iterator_seek(pfVar4,&((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->handle_busy,8,
                                 '\x01');
      if (fVar12 == FDB_RESULT_SUCCESS) {
        fconfig_01 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115476;
          fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                            seqtree_opt);
          if (fVar12 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115489;
          sprintf((char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask,
                  "0xff length %d",fconfig_01);
          sVar15 = *(size_t *)
                    (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                    0x10);
          pfVar57 = *(filemgr **)
                     (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                     0x40);
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1154a1;
          iVar13 = bcmp(pfVar57,&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                 compaction_cb_mask,sVar15);
          if (iVar13 != 0) goto LAB_0011562e;
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1154b3;
          fVar12 = fdb_iterator_next(pfVar4);
          fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 + 1);
        } while (fVar12 == FDB_RESULT_SUCCESS);
      }
      pfVar21 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
      doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask;
      pcVar56 = "0xff length %d";
      pfVar53 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1154c3;
      fVar12 = fdb_iterator_close((fdb_iterator *)pfVar53);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115654;
      pfVar53 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_buf_maxsize;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold = 0;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1154f3;
      fVar12 = fdb_iterator_init(pfVar53,(fdb_iterator **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                          wal_flush_before_commit,(void *)0x0,0,
                                 &((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->handle_busy,0x100,
                                 (fdb_iterator_opt_t)
                                 (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold)
      ;
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115659;
      pfVar53 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115505;
      fVar12 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar53);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011565e;
      fconfig_01 = (atomic<unsigned_char> *)0x1d;
      pfVar21 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
      pcVar56 = "0xff length %d";
      doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask;
      do {
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115530;
        fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)pfVar21);
        if (fVar12 != FDB_RESULT_SUCCESS) break;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115543;
        sprintf(doc_01,"0xff length %d",fconfig_01);
        sVar15 = *(size_t *)
                  (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt + 0x10
                  );
        pfVar57 = *(filemgr **)
                   (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                   0x40);
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11555b;
        iVar13 = bcmp(pfVar57,doc_01,sVar15);
        if (iVar13 != 0) goto LAB_00115614;
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11556d;
        fVar12 = fdb_iterator_prev(pfVar4);
        fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 - 1);
      } while (fVar12 == FDB_RESULT_SUCCESS);
      pfVar53 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11557d;
      fVar12 = fdb_iterator_close((fdb_iterator *)pfVar53);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115663;
      pfVar53 = (fdb_kvs_handle *)
                (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11558f;
      fVar12 = fdb_close((fdb_file_handle *)pfVar53);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115668;
      pfVar53 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
      pfVar53->op_stats = (kvs_ops_stat *)0x0;
      (pfVar53->field_6).seqtree = (btree *)0x0;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1155ab;
      fVar12 = fdb_doc_free((fdb_doc *)pfVar53);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011566d;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1155b8;
      fVar12 = fdb_shutdown();
      if (fVar12 == FDB_RESULT_SUCCESS) {
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1155c5;
        memleak_end();
        pcVar56 = "%s PASSED\n";
        if (iterator_extreme_key_test()::__test_pass != '\0') {
          pcVar56 = "%s FAILED\n";
        }
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1155f6;
        fprintf(_stderr,pcVar56,"iterator extreme key test");
        return;
      }
    }
    else {
LAB_0011563b:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115640;
      iterator_extreme_key_test();
LAB_00115640:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115645;
      iterator_extreme_key_test();
LAB_00115645:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11564a;
      iterator_extreme_key_test();
LAB_0011564a:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11564f;
      iterator_extreme_key_test();
LAB_0011564f:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115654;
      iterator_extreme_key_test();
LAB_00115654:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115659;
      iterator_extreme_key_test();
LAB_00115659:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11565e;
      iterator_extreme_key_test();
LAB_0011565e:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115663;
      iterator_extreme_key_test();
LAB_00115663:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115668;
      iterator_extreme_key_test();
LAB_00115668:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11566d;
      iterator_extreme_key_test();
LAB_0011566d:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115672;
      iterator_extreme_key_test();
    }
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size =
         (uint64_t)iterator_inmem_snapshot_seek_test;
    iterator_extreme_key_test();
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = (uint64_t)pcVar55;
    *(char **)&((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config = pcVar56;
    ((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->fileops = (filemgr_ops *)pfVar21;
    ((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->btreeblkops = (btree_blk_ops *)pfVar57;
    ((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->bhandle = (btreeblk_handle *)doc_01;
    ((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->dhandle = (docio_handle *)fconfig_01;
    sVar15 = (ulong)pfVar53 & 0xffffffff;
    pvVar63 = (void *)0x0;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x11569c;
    gettimeofday((timeval *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->bhandle,
                 (__timezone_ptr_t)0x0);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1156a1;
    memleak_start();
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).num_entries = 0;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1156b2;
    system("rm -rf  iterator_test* > errorlog.txt");
    pfVar25 = (fdb_doc *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->config).num_blocks_readahead;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1156c2;
    fdb_get_default_config();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1156cc;
    fdb_get_default_kvs_config();
    (((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->log_callback).callback = (fdb_log_callback)0x0;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->log_callback).callback_ex =
         (fdb_log_callback_ex)0x400;
    *(undefined4 *)
     ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->cur_header_revnum).
             super___atomic_base<unsigned_long>._M_i + 4) = 1;
    *(undefined1 *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->rollback_revnum + 7) = 0;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1156f7;
    fVar12 = fdb_open((fdb_file_handle **)(_Var23._M_i + -0x1040),"./iterator_test1",
                      (fdb_config *)pfVar25);
    if (fVar12 == FDB_RESULT_SUCCESS) {
      *(int *)((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config).custom_cmp + 4) =
           (int)pfVar53;
      pfVar21 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115717;
      fVar12 = fdb_kvs_open_default
                         ((fdb_file_handle *)pfVar21,
                          &(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).handle,
                          (fdb_kvs_config *)
                          &(((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config).
                           custom_cmp_param);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115b0c;
      pfVar57 = (filemgr *)0x0;
      uVar24 = 0;
      do {
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115742;
        sprintf((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->btreeblkops,"%c2",
                (ulong)((int)uVar24 + 0x61));
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x11575b;
        sprintf((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->log_callback,"meta%d",
                uVar24 & 0xffffffff);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115774;
        sprintf((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->fileops,"body%d",
                uVar24 & 0xffffffff);
        doc_01 = (char *)(_Var23._M_i + (long)pfVar57 + -0x1018);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115784;
        sVar15 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->btreeblkops);
        pfVar25 = (fdb_doc *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->log_callback;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115797;
        pcVar56 = (char *)strlen((char *)pfVar25);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1157a7;
        sVar17 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->fileops);
        *(size_t *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators = sVar17;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1157cc;
        fdb_doc_create((fdb_doc **)doc_01,&((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->btreeblkops,
                       sVar15,pfVar25,(size_t)pcVar56,
                       &((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->fileops,
                       *(size_t *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators);
        pfVar21 = (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).handle;
        doc = *(fdb_doc **)(_Var23._M_i + uVar24 * 8 + -0x1018);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1157db;
        fdb_set(pfVar21,doc);
        uVar24 = uVar24 + 1;
        pfVar57 = (filemgr *)((long)pfVar57 + 8);
      } while (uVar24 != 5);
      pfVar21 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config;
      opt = *(fdb_commit_opt_t *)
             ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config).custom_cmp + 4);
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1157fb;
      fdb_commit((fdb_file_handle *)pfVar21,opt);
      pfVar21 = (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).handle;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115811;
      fVar12 = fdb_snapshot_open(pfVar21,(fdb_kvs_handle **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).
                                          space_used,0xffffffffffffffff);
      pvVar63 = (void *)0x5;
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115b11;
      pfVar21 = (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).handle;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115831;
      fVar12 = fdb_set_log_callback(pfVar21,logCallbackFunc,"iterator_inmem_snapshot_seek_test");
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115b16;
      pfVar21 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators = 0xe;
      pfVar25 = (fdb_doc *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x11586b;
      fdb_iterator_init(pfVar21,(fdb_iterator **)pfVar25,"b2",2,"d2",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators);
      pfVar4 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar25)->entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115884;
      fVar12 = fdb_iterator_seek(pfVar4,"c1",2,'\x01');
      if (fVar12 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b1b;
      pfVar4 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1158a5;
      fVar12 = fdb_iterator_seek(pfVar4,"c3",2,'\0');
      if (fVar12 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b20;
      pfVar25 = (fdb_doc *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx;
      pfVar4 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar25)->entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1158bb;
      fdb_iterator_close(pfVar4);
      pfVar21 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators = 0xe;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1158e8;
      fdb_iterator_init(pfVar21,(fdb_iterator **)pfVar25,"b3",2,"d1",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators);
      pfVar4 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar25)->entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115901;
      fVar12 = fdb_iterator_seek(pfVar4,"c1",2,'\x01');
      if (fVar12 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b25;
      pfVar4 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115922;
      fVar12 = fdb_iterator_seek(pfVar4,"c3",2,'\0');
      if (fVar12 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b2a;
      pfVar25 = (fdb_doc *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx;
      pfVar4 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar25)->entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115938;
      fdb_iterator_close(pfVar4);
      pfVar21 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators = 0xe;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115965;
      fdb_iterator_init(pfVar21,(fdb_iterator **)pfVar25,"b0",2,"e2",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators);
      pfVar4 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar25)->entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x11596d;
      fVar12 = fdb_iterator_seek_to_max(pfVar4);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115b2f;
      pfVar4 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115984;
      fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                       &(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).
                                        num_entries);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115b34;
      pfVar25 = (fdb_doc *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).num_entries;
      sVar17 = pfVar25->keylen;
      pvVar63 = pfVar25->key;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1159a7;
      iVar13 = bcmp(pvVar63,"d2",sVar17);
      if (iVar13 != 0) goto LAB_00115b39;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1159b7;
      fdb_doc_free(pfVar25);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).num_entries = 0;
      pfVar4 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1159d8;
      fVar12 = fdb_iterator_seek(pfVar4,"e2",2,'\0');
      if (fVar12 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b41;
      pfVar4 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1159eb;
      fVar12 = fdb_iterator_seek_to_min(pfVar4);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115b46;
      pfVar4 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a02;
      fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                       &(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).
                                        num_entries);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115b4b;
      pfVar25 = (fdb_doc *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).num_entries;
      sVar17 = pfVar25->keylen;
      pvVar63 = pfVar25->key;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a25;
      iVar13 = bcmp(pvVar63,"c2",sVar17);
      if (iVar13 != 0) goto LAB_00115b50;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a35;
      fdb_doc_free(pfVar25);
      pfVar4 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a50;
      fVar12 = fdb_iterator_seek(pfVar4,"b0",2,'\x01');
      if (fVar12 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b58;
      pfVar4 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a74;
      fVar12 = fdb_iterator_seek(pfVar4,"b0",2,'\x01');
      if (fVar12 == FDB_RESULT_ITERATOR_FAIL) {
        pfVar4 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a87;
        fdb_iterator_close(pfVar4);
        pfVar21 = (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).handle;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a91;
        fdb_kvs_close(pfVar21);
        pfVar21 = (fdb_kvs_handle *)
                  (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).space_used;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a9b;
        fdb_kvs_close(pfVar21);
        pfVar21 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115aa5;
        fdb_close((fdb_file_handle *)pfVar21);
        lVar58 = 0;
        do {
          pfVar25 = *(fdb_doc **)(_Var23._M_i + lVar58 * 8 + -0x1018);
          ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115ab1;
          fdb_doc_free(pfVar25);
          lVar58 = lVar58 + 1;
        } while (lVar58 != 5);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115abf;
        fdb_shutdown();
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115ac4;
        memleak_end();
        pcVar56 = "%s PASSED\n";
        if (iterator_inmem_snapshot_seek_test(bool)::__test_pass != '\0') {
          pcVar56 = "%s FAILED\n";
        }
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115af5;
        fprintf(_stderr,pcVar56,"in-memory snapshot seek test");
        return;
      }
    }
    else {
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b0c;
      iterator_inmem_snapshot_seek_test();
LAB_00115b0c:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b11;
      iterator_inmem_snapshot_seek_test();
LAB_00115b11:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b16;
      iterator_inmem_snapshot_seek_test();
LAB_00115b16:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b1b;
      iterator_inmem_snapshot_seek_test();
LAB_00115b1b:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b20;
      iterator_inmem_snapshot_seek_test();
LAB_00115b20:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b25;
      iterator_inmem_snapshot_seek_test();
LAB_00115b25:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b2a;
      iterator_inmem_snapshot_seek_test();
LAB_00115b2a:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b2f;
      iterator_inmem_snapshot_seek_test();
LAB_00115b2f:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b34;
      iterator_inmem_snapshot_seek_test();
LAB_00115b34:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b39;
      iterator_inmem_snapshot_seek_test();
LAB_00115b39:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b41;
      iterator_inmem_snapshot_seek_test();
LAB_00115b41:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b46;
      iterator_inmem_snapshot_seek_test();
LAB_00115b46:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b4b;
      iterator_inmem_snapshot_seek_test();
LAB_00115b4b:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b50;
      iterator_inmem_snapshot_seek_test();
LAB_00115b50:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b58;
      iterator_inmem_snapshot_seek_test();
LAB_00115b58:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b5d;
      iterator_inmem_snapshot_seek_test();
    }
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)iterator_no_deletes_test;
    iterator_inmem_snapshot_seek_test();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)sVar15;
    *(char **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->handle_busy = pcVar56;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->txn = (fdb_txn *)pvVar63;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->filename = (char *)pfVar57;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->max_seqnum = (fdb_seqnum_t)doc_01;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->seqnum = (fdb_seqnum_t)pfVar25;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115b82;
    gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).seqtree_opt,
                 (__timezone_ptr_t)0x0);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115b87;
    memleak_start();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats = (kvs_ops_stat *)0x0;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115b9c;
    system("rm -rf  iterator_test* > errorlog.txt");
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115bac;
    fdb_get_default_config();
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115bbc;
    fdb_get_default_kvs_config();
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).compaction_cb =
         (fdb_compaction_callback)0x400;
    *(undefined4 *)
     ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).compaction_cb_ctx + 4) = 1;
    *(undefined1 *)
     ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).max_writer_lock_prob + 7) = 0;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115be6;
    fdb_open((fdb_file_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->staletree,
             "./iterator_test",
             (fdb_config *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).prefetch_duration)
    ;
    pbVar7 = ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->staletree;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115bfd;
    fdb_kvs_open((fdb_file_handle *)pbVar7,
                 (fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle,"all_docs"
                 ,(fdb_kvs_config *)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).compaction_minimum_filesize
                );
    __s = &(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->config).compactor_sleep_duration;
    __s_00 = &((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->seqnum;
    lVar58 = 0;
    uVar24 = 0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c27;
      sprintf((char *)__s,"key%d",uVar24 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c3b;
      sprintf((char *)__s_00,"body%d",uVar24 & 0xffffffff);
      lVar10 = lVar58 + -0x1410;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c4b;
      sVar15 = strlen((char *)__s);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c56;
      sVar17 = strlen((char *)__s_00);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp_param = (void *)sVar17;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c70;
      fdb_doc_create((fdb_doc **)(_Var23._M_i + lVar10),__s,sVar15,(void *)0x0,0,__s_00,
                     (size_t)(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).
                             custom_cmp_param);
      pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
      pfVar25 = *(fdb_doc **)(_Var23._M_i + uVar24 * 8 + -0x1410);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c7f;
      fdb_set(pfVar21,pfVar25);
      uVar24 = uVar24 + 1;
      lVar58 = lVar58 + 8;
    } while (uVar24 != 10);
    doc_00 = (list *)0x0;
    do {
      pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
      psVar8 = *(size_t **)(_Var23._M_i + (long)doc_00 * 8 + -0x1410);
      keylen = *psVar8;
      pvVar63 = (void *)psVar8[4];
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115ca4;
      fVar12 = fdb_del_kv(pfVar21,pvVar63,keylen);
      if (fVar12 != FDB_RESULT_SUCCESS) {
        (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115e0c;
        iterator_no_deletes_test();
        goto LAB_00115e0c;
      }
      doc_00 = (list *)((long)&doc_00->head + 1);
    } while (doc_00 != (list *)0xa);
    pbVar7 = ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->staletree;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115cc1;
    fdb_commit((fdb_file_handle *)pbVar7,'\0');
    pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
    pfVar25 = (fdb_doc *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->dhandle;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115cd0;
    fVar12 = fdb_set(pfVar21,pfVar25);
    if (fVar12 == FDB_RESULT_SUCCESS) {
      pfVar57 = ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->dhandle->file;
      pvVar63 = (void *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->dhandle->lastBmpRevnum;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp_param = (void *)0x0;
      doc_00 = (list *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d01;
      fdb_doc_create((fdb_doc **)doc_00,pvVar63,(size_t)pfVar57,(void *)0x0,0,(void *)0x0,
                     (size_t)(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).
                             custom_cmp_param);
      pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
      pfVar25 = *(fdb_doc **)doc_00;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d0e;
      fVar12 = fdb_get(pfVar21,pfVar25);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115e11;
      if ((char)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats[1].num_commits.
                super___atomic_base<unsigned_long>._M_i != '\0') {
        (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115d2b;
        iterator_no_deletes_test();
      }
      pfVar25 = (fdb_doc *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d35;
      fdb_doc_free(pfVar25);
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats = (kvs_ops_stat *)0x0;
      pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp_param = 2
      ;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d5e;
      fVar12 = fdb_iterator_init(pfVar21,(fdb_iterator **)
                                         &((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->trie,
                                 (void *)0x0,0,(void *)0x0,0,
                                 *(fdb_iterator_opt_t *)
                                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).
                                   custom_cmp_param);
      if (fVar12 == FDB_RESULT_SUCCESS) {
        pfVar4 = (fdb_iterator *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->trie;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115d75;
        fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                         &((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats);
        if (fVar12 == FDB_RESULT_SUCCESS) {
          pfVar25 = (fdb_doc *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115d87;
          fdb_doc_free(pfVar25);
          pfVar4 = (fdb_iterator *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->trie;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115d91;
          fdb_iterator_close(pfVar4);
          lVar58 = 0;
          do {
            pfVar25 = *(fdb_doc **)(_Var23._M_i + lVar58 * 8 + -0x1410);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
                 (fdb_custom_cmp_variable)0x115d9d;
            fdb_doc_free(pfVar25);
            lVar58 = lVar58 + 1;
          } while (lVar58 != 10);
          pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115db0;
          fdb_kvs_close(pfVar21);
          pbVar7 = ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->staletree;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115dba;
          fdb_close((fdb_file_handle *)pbVar7);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115dbf;
          fdb_shutdown();
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115dc4;
          memleak_end();
          pcVar56 = "%s PASSED\n";
          if (iterator_no_deletes_test()::__test_pass != '\0') {
            pcVar56 = "%s FAILED\n";
          }
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115df5;
          fprintf(_stderr,pcVar56,"iterator no deletes test");
          return;
        }
        goto LAB_00115e1b;
      }
    }
    else {
LAB_00115e0c:
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115e11;
      iterator_no_deletes_test();
LAB_00115e11:
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115e16;
      iterator_no_deletes_test();
    }
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115e1b;
    iterator_no_deletes_test();
LAB_00115e1b:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         iterator_set_del_docs_test;
    iterator_no_deletes_test();
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)(_Var23._M_i + lVar10);
    *(long *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config = lVar58;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1658))->bub_ctx).handle = (fdb_kvs_handle *)__s;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1658))->bub_ctx).space_used = 10;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1658))->bub_ctx).num_entries = (uint64_t)__s_00;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1658))->bub_ctx).entries = doc_00;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e3d;
    gettimeofday((timeval *)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).multi_kv_instances,
                 (__timezone_ptr_t)0x0);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e42;
    memleak_start();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e52;
    fdb_get_default_config();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e62;
    fdb_get_default_kvs_config();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e6e;
    system("rm -rf  iterator_test* > errorlog.txt");
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.algorithm = 0x400;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.bytes[0] = '\0';
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.bytes[1] = '\0';
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.bytes[2] = '\0';
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.bytes[3] = '\0';
    pfVar9 = &((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config;
    (pfVar9->encryption_key).bytes[0x10] = '\x01';
    (pfVar9->encryption_key).bytes[0x11] = '\0';
    (pfVar9->encryption_key).bytes[0x12] = '\0';
    (pfVar9->encryption_key).bytes[0x13] = '\0';
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.bytes[0x1b] = '\n';
    pfVar9 = &((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config;
    (pfVar9->encryption_key).bytes[8] = '\x01';
    (pfVar9->encryption_key).bytes[9] = '\0';
    (pfVar9->encryption_key).bytes[10] = '\0';
    (pfVar9->encryption_key).bytes[0xb] = '\0';
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e9c;
    fdb_open((fdb_file_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->fileops,
             "./iterator_test1",
             (fdb_config *)
             &(((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).enable_background_compactor);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115eb3;
    fdb_kvs_open((fdb_file_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->fileops,
                 (fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file,"kv1",
                 (fdb_kvs_config *)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).num_wal_partitions);
    psVar8 = &(((fdb_kvs_handle *)(_Var23._M_i + -0x1658))->config).max_writer_lock_prob;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->bhandle = (btreeblk_handle *)0x0;
    iVar13 = 0;
    do {
      *(int *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->dhandle + 4) = iVar13;
      lVar58 = 0;
      uVar24 = 0;
      do {
        uVar19 = *(uint *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->dhandle + 4);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115ef3;
        sprintf((char *)psVar8,"key%02d%03d",(ulong)uVar19,uVar24 & 0xffffffff);
        __s_01 = &((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->bub_ctx;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f12;
        sprintf((char *)__s_01,"meta%02d%03d",(ulong)uVar19,uVar24 & 0xffffffff);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f29;
        sprintf((char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).compaction_cb_ctx,
                "body%02d%03d",(ulong)uVar19,uVar24 & 0xffffffff);
        *(undefined1 **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config =
             (undefined1 *)(_Var23._M_i + lVar58 + -0x1a98);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f40;
        sVar15 = strlen((char *)psVar8);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f4b;
        sVar17 = strlen((char *)__s_01);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f5b;
        sVar18 = strlen((char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).
                                 compaction_cb_ctx);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->staletree = (btree *)sVar18;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f80;
        fdb_doc_create(*(fdb_doc ***)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config,psVar8,
                       sVar15,__s_01,sVar17,
                       &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).compaction_cb_ctx,
                       (size_t)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->staletree);
        pfVar25 = *(fdb_doc **)(_Var23._M_i + uVar24 * 8 + -0x1a98);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f92;
        fdb_set((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file,pfVar25);
        uVar24 = uVar24 + 1;
        lVar58 = lVar58 + 8;
      } while (uVar24 != 100);
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115fb2;
      fdb_commit((fdb_file_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->fileops,'\x01');
      lVar58 = 0;
      do {
        pfVar25 = *(fdb_doc **)(_Var23._M_i + lVar58 * 8 + -0x19d0);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115fc6;
        fdb_del((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file,pfVar25);
        lVar58 = lVar58 + 1;
      } while (lVar58 != 0x19);
      pbVar26 = (btreeblk_handle *)
                ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->bhandle->blockpool).head + 3);
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115fe7;
      fdb_commit((fdb_file_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->fileops,'\x01');
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115ff6;
      fdb_get_kvs_info((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file,
                       (fdb_kvs_info *)
                       &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).wal_threshold);
      pbVar59 = *(btreeblk_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).seqtree_opt;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->bhandle = pbVar26;
      if (pbVar59 != pbVar26) {
        *(undefined4 *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->staletree = 0;
        uVar24 = 0;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x116025;
        fdb_iterator_init((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file,
                          (fdb_iterator **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->btreeblkops
                          ,(void *)0x0,0,(void *)0x0,0,
                          *(fdb_iterator_opt_t *)
                           &((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->staletree);
        do {
          ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x116037;
          fdb_iterator_get((fdb_iterator *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->btreeblkops,
                           (fdb_doc **)
                           &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).buffercache_size);
          pfVar25 = (fdb_doc *)
                    (((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).buffercache_size;
          uVar24 = (ulong)((int)uVar24 + (pfVar25->deleted ^ 1));
          ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x11604b;
          fdb_doc_free(pfVar25);
          ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x116055;
          fVar12 = fdb_iterator_next((fdb_iterator *)
                                     ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->btreeblkops);
        } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x116064;
        fdb_iterator_close((fdb_iterator *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->btreeblkops)
        ;
        pbVar26 = ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->bhandle;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x11607c;
        printf("dbdocs(%d) expected(%d)\n",uVar24,(ulong)pbVar26 & 0xffffffff);
      }
      if (*(btreeblk_handle **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).seqtree_opt !=
          pbVar26) {
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x1160b9;
        iterator_set_del_docs_test();
      }
      lVar58 = 0;
      do {
        pfVar25 = *(fdb_doc **)(_Var23._M_i + lVar58 * 8 + -0x1a98);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x116092;
        fdb_doc_free(pfVar25);
        lVar58 = lVar58 + 1;
      } while (lVar58 != 100);
      iVar13 = *(int *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->dhandle + 4) + 1;
    } while (iVar13 != 0x14);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x1160c5;
    fdb_kvs_close((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x1160cf;
    fdb_close((fdb_file_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->fileops);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x1160d4;
    fdb_shutdown();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x1160d9;
    memleak_end();
    pcVar56 = "%s PASSED\n";
    if (iterator_set_del_docs_test()::__test_pass != '\0') {
      pcVar56 = "%s FAILED\n";
    }
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x11610a;
    fprintf(_stderr,pcVar56,"iterator set del docs");
    return;
  }
  pfVar3 = *(fdb_file_handle **)
            ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11332a;
  fVar12 = fdb_kvs_open(pfVar3,(fdb_kvs_handle **)
                               &((fdb_kvs_handle *)(_Var23._M_i + -0x618))->max_seqnum,"prev KVS",
                        (fdb_kvs_config *)
                        &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).num_wal_partitions);
  pcVar55 = (char *)&aStack_370;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150bc;
  pfVar3 = *(fdb_file_handle **)
            ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113350;
  fVar12 = fdb_kvs_open(pfVar3,(fdb_kvs_handle **)
                               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key,
                        "cur KVS",
                        (fdb_kvs_config *)
                        &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).num_wal_partitions);
  pcVar55 = (char *)&aStack_370;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150c1;
  pfVar3 = *(fdb_file_handle **)
            ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113379;
  fVar12 = fdb_kvs_open(pfVar3,(fdb_kvs_handle **)
                               &((fdb_kvs_handle *)(_Var23._M_i + -0x618))->shandle,"next KVS",
                        (fdb_kvs_config *)
                        &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).num_wal_partitions);
  pcVar55 = (char *)&aStack_370;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150c6;
  ((fdb_kvs_handle *)(_Var23._M_i + -0x618))->kv_info_offset = (uint64_t)pfVar21;
  fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig_00 = (void *)0x79656b5f76657270;
  *(undefined1 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).max_writer_lock_prob = 0;
  pfVar21 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
  *(char **)pfVar21 = (char *)0x6c61765f76657270;
  *(undefined4 *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename + 7) = 0x65756c;
  pcVar56 = (char *)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->max_seqnum;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133cf;
  sVar15 = strlen(fconfig_00);
  doc_01 = (char *)(sVar15 + 1);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133db;
  sVar15 = strlen((char *)pfVar21);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133f0;
  fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar56,fconfig_00,(size_t)doc_01,pfVar21,sVar15 + 1);
  pcVar55 = (char *)&aStack_370;
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150cb;
  pcVar60 = (char *)0x79656b5f7478656e;
  fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig_00 = (void *)0x79656b5f7478656e;
  *(undefined1 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).max_writer_lock_prob = 0;
  pcVar55 = (char *)0x6c61765f7478656e;
  pfVar21 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
  *(char **)pfVar21 = (char *)0x6c61765f7478656e;
  *(undefined4 *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename + 7) = 0x65756c;
  pcVar56 = (char *)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->shandle;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11343e;
  sVar15 = strlen(fconfig_00);
  doc_01 = (char *)(sVar15 + 1);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11344a;
  sVar15 = strlen((char *)pfVar21);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11345f;
  fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar56,fconfig_00,(size_t)doc_01,pfVar21,sVar15 + 1);
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150d0;
  fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig_00 = (void *)0x79656b5f7478656e;
  *(undefined2 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).max_writer_lock_prob = 0x32;
  pfVar21 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
  *(char **)pfVar21 = (char *)0x6c61765f7478656e;
  *(undefined4 *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->txn = 0x326575;
  pcVar56 = (char *)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->shandle;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11349b;
  sVar15 = strlen(fconfig_00);
  doc_01 = (char *)(sVar15 + 1);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1134a7;
  sVar15 = strlen((char *)pfVar21);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1134bc;
  fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar56,fconfig_00,(size_t)doc_01,pfVar21,sVar15 + 1);
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150d5;
  pfVar3 = *(fdb_file_handle **)
            ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1134d3;
  fVar12 = fdb_commit(pfVar3,'\x01');
  if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150da;
  if ((int)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->kv_info_offset == 0) {
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar56 = "value%08d";
    doc_01 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pcVar60 = (char *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113519;
      sprintf((char *)pfVar21,"key%06d",(ulong)pcVar60 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113529;
      sprintf(doc_01,"value%08d",(ulong)pcVar60 & 0xffffffff);
      pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113536;
      sVar15 = strlen((char *)pfVar21);
      fconfig_00 = (char *)(sVar15 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113542;
      sVar15 = strlen(doc_01);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113557;
      fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pfVar21,(size_t)fconfig_00,doc_01,sVar15 + 1);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011502c;
      *(undefined4 *)(_Var23._M_i + (long)pcVar60 * 4 + -0x4f8) = 0;
      pcVar60 = &((fdb_kvs_config *)&((filemgr *)pcVar60)->filename)->field_0x1;
    } while ((uint8_t *)pcVar60 != (uint8_t *)0x1e);
    pfVar3 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113580;
    fVar12 = fdb_commit(pfVar3,'\x01');
    pfVar57 = (filemgr *)pcVar60;
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115154;
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_001135f0:
      pfVar21 = (fdb_kvs_handle *)
                &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
      pcVar56 = "value%08d(WAL)";
      doc_01 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
      pcVar60 = (char *)(filemgr *)0x0;
      do {
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11361e;
        sprintf((char *)pfVar21,"key%06d",(ulong)pcVar60 & 0xffffffff);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11362e;
        sprintf(doc_01,"value%08d(WAL)",(ulong)pcVar60 & 0xffffffff);
        pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11363b;
        sVar15 = strlen((char *)pfVar21);
        fconfig_00 = (char *)(sVar15 + 1);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113647;
        sVar15 = strlen(doc_01);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11365c;
        fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pfVar21,(size_t)fconfig_00,doc_01,sVar15 + 1);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115031;
        *(undefined4 *)(_Var23._M_i + (long)pcVar60 * 4 + -0x4f8) = 1;
        pfVar57 = (filemgr *)&((fdb_kvs_config *)&((filemgr *)pcVar60)->filename)->field_0x2;
        bVar64 = pcVar60 < (filemgr *)0x1c;
        pcVar60 = (char *)pfVar57;
      } while (bVar64);
      pfVar3 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113686;
      fVar12 = fdb_commit(pfVar3,'\0');
      if (fVar12 == FDB_RESULT_SUCCESS) {
LAB_0011368e:
        pfVar53 = *(fdb_kvs_handle **)
                   &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
        *(uint *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).max_writer_lock_prob =
             (uint)(*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.
                             bytes + 0x10) != 0) * 2;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136b6;
        fVar12 = fdb_iterator_init(pfVar53,(fdb_iterator **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                            enable_background_compactor,(void *)0x0,0,(void *)0x0,0,
                                   (fdb_iterator_opt_t)
                                   (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                   max_writer_lock_prob);
        pcVar60 = (char *)pfVar57;
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150df;
        fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
        pcVar55 = "value%08d";
        pfVar21 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        pcVar56 = (char *)0x0;
        do {
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136e2;
          fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)fconfig_00);
          if (fVar12 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar12 != FDB_RESULT_SUCCESS) break;
            uVar19 = (int)pcVar56 +
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pcVar56 * 4 + -0x4f8) == 2);
            pcVar56 = (char *)(ulong)uVar19;
            pcVar60 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
              pcVar60 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11371d;
            sprintf((char *)pfVar21,pcVar60,(ulong)uVar19);
            doc_01 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                             num_bgflusher_threads;
            sVar15 = ((btreeblk_handle *)doc_01)->ndeltanodes;
            pcVar60 = (char *)((btreeblk_handle *)doc_01)->log_callback;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113737;
            iVar13 = bcmp(pcVar60,pfVar21,sVar15);
            if (iVar13 != 0) goto LAB_00115060;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113747;
            fdb_doc_free((fdb_doc *)doc_01);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pcVar56 = (char *)(ulong)(uVar19 + 1);
          }
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11375d;
          fVar12 = fdb_iterator_next(pfVar4);
        } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pcVar56 != 0x1e) goto LAB_001150e4;
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11377a;
        fVar12 = fdb_iterator_prev(pfVar4);
        if (fVar12 == FDB_RESULT_ITERATOR_FAIL) {
LAB_001150b2:
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150b7;
          iterator_complete_test();
          goto LAB_001150b7;
        }
        fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
        pcVar55 = "value%08d";
        pfVar21 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        do {
          uVar19 = (int)pcVar56 - 1;
          pcVar56 = (char *)(ulong)uVar19;
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1137a7;
          fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)fconfig_00);
          if (fVar12 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar12 != FDB_RESULT_SUCCESS) break;
            uVar19 = uVar19 - (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) == 2);
            pcVar56 = (char *)(ulong)uVar19;
            pcVar60 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
              pcVar60 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1137e2;
            sprintf((char *)pfVar21,pcVar60,(ulong)uVar19);
            doc_01 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                             num_bgflusher_threads;
            sVar15 = ((btreeblk_handle *)doc_01)->ndeltanodes;
            pcVar60 = (char *)((btreeblk_handle *)doc_01)->log_callback;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1137fc;
            iVar13 = bcmp(pcVar60,pfVar21,sVar15);
            if (iVar13 != 0) goto LAB_00115070;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11380c;
            fdb_doc_free((fdb_doc *)doc_01);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
          }
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11381f;
          fVar12 = fdb_iterator_prev(pfVar4);
        } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pcVar56 != 0) goto LAB_001150b2;
        pcVar56 = "key%06d";
        doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar55 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        pfVar21 = (fdb_kvs_handle *)0x0;
        do {
          if (pfVar21 == (fdb_kvs_handle *)0x1e) goto LAB_00113950;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113865;
          sprintf(doc_01,"key%06d",(ulong)pfVar21 & 0xffffffff);
          fconfig_00 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                  enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113872;
          sVar15 = strlen(doc_01);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113883;
          fVar12 = fdb_iterator_seek((fdb_iterator *)fconfig_00,doc_01,sVar15 + 1,'\0');
          if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00114ffa;
          iVar13 = *(int *)(_Var23._M_i + (long)pfVar21 * 4 + -0x4f8);
          puVar1 = &(pfVar21->kvs_config).field_0x1;
          *(uint8_t **)
           ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x14) =
               puVar1;
          uVar24 = (ulong)puVar1 & 0xffffffff;
          if (iVar13 != 2) {
            uVar24 = (ulong)pfVar21 & 0xffffffff;
          }
          do {
            uVar19 = (uint)uVar24;
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1138ad;
            fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar12 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1138c4;
            sprintf(doc_01,"key%06d",uVar24);
            uVar19 = uVar19 + (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) == 2);
            pcVar60 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
              pcVar60 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1138f7;
            sprintf(pcVar55,pcVar60,(ulong)uVar19);
            pfVar21 = (fdb_kvs_handle *)
                      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads;
            pvVar63 = (pfVar21->kvs_config).custom_cmp_param;
            pcVar60 = (char *)(pfVar21->field_6).seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11390f;
            iVar13 = bcmp(pcVar60,pcVar55,(size_t)pvVar63);
            if (iVar13 != 0) {
              (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                   (void *)0x114f8a;
              iterator_complete_test();
              goto LAB_00114f8a;
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11391f;
            fdb_doc_free((fdb_doc *)pfVar21);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar19 = uVar19 + 1;
            uVar24 = (ulong)uVar19;
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113934;
            fVar12 = fdb_iterator_next(pfVar4);
          } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
          pfVar21 = *(fdb_kvs_handle **)
                     ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes +
                     0x14);
        } while (uVar19 == 0x1e);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113950;
        iterator_complete_test();
LAB_00113950:
        pcVar56 = "key%06d";
        doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar55 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        pfVar21 = (fdb_kvs_handle *)0x0;
        do {
          if (pfVar21 == (fdb_kvs_handle *)0x1e) goto LAB_00113a6f;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113984;
          sprintf(doc_01,"key%06d",(ulong)pfVar21 & 0xffffffff);
          fconfig_00 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                  enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113991;
          sVar15 = strlen(doc_01);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1139a2;
          fVar12 = fdb_iterator_seek((fdb_iterator *)fconfig_00,doc_01,sVar15 + 1,'\0');
          if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00114fff;
          iVar13 = *(int *)(_Var23._M_i + (long)pfVar21 * 4 + -0x4f8);
          puVar1 = &(pfVar21->kvs_config).field_0x1;
          *(uint8_t **)
           ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x14) =
               puVar1;
          uVar24 = (ulong)puVar1 & 0xffffffff;
          if (iVar13 != 2) {
            uVar24 = (ulong)pfVar21 & 0xffffffff;
          }
          do {
            uVar19 = (uint)uVar24;
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1139cc;
            fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar12 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1139e3;
            sprintf(doc_01,"key%06d",uVar24);
            uVar19 = uVar19 - (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) == 2);
            pcVar60 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
              pcVar60 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a16;
            sprintf(pcVar55,pcVar60,(ulong)uVar19);
            pfVar21 = (fdb_kvs_handle *)
                      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads;
            pvVar63 = (pfVar21->kvs_config).custom_cmp_param;
            pcVar60 = (char *)(pfVar21->field_6).seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a2e;
            iVar13 = bcmp(pcVar60,pcVar55,(size_t)pvVar63);
            if (iVar13 != 0) goto LAB_00114f8a;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a3e;
            fdb_doc_free((fdb_doc *)pfVar21);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar19 = uVar19 - 1;
            uVar24 = (ulong)uVar19;
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a53;
            fVar12 = fdb_iterator_prev(pfVar4);
          } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
          pfVar21 = *(fdb_kvs_handle **)
                     ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes +
                     0x14);
        } while (uVar19 == 0xffffffff);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113a6f;
        iterator_complete_test();
LAB_00113a6f:
        doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar55 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        fconfig_00 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113a94;
          sprintf(doc_01,"key%06d",(ulong)fconfig_00 & 0xffffffff);
          pfVar21 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113aa1;
          sVar15 = strlen(doc_01);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ab5;
          fVar12 = fdb_iterator_seek((fdb_iterator *)pfVar21,doc_01,sVar15 + 1,'\x01');
          if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115004;
          pfVar21 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)(_Var23._M_i + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113adc;
            fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar12 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113af8;
            sprintf(doc_01,"key%06d",pfVar21);
            uVar19 = (int)pfVar21 +
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar19;
            pcVar56 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
              pcVar56 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b2e;
            sprintf(pcVar55,pcVar56,(ulong)uVar19);
            pcVar60 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
            paVar5 = ((avl_node *)&((filemgr *)pcVar60)->blocksize)->parent;
            pcVar56 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar60)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b46;
            iVar13 = bcmp(pcVar56,pcVar55,(size_t)paVar5);
            if (iVar13 != 0) goto LAB_00114f9a;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b56;
            fdb_doc_free((fdb_doc *)pcVar60);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar21 = (fdb_kvs_handle *)(ulong)(uVar19 + 1);
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b6c;
            fVar12 = fdb_iterator_next(pfVar4);
          } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar21 != 0x1e) goto LAB_00115009;
          fconfig_00 = (char *)((long)&((fdb_iterator *)fconfig_00)->handle + 1);
        } while ((fdb_iterator *)fconfig_00 != (fdb_iterator *)0x1e);
        doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar55 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        fconfig_00 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113bb1;
          sprintf(doc_01,"key%06d",(ulong)fconfig_00 & 0xffffffff);
          pfVar21 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113bbe;
          sVar15 = strlen(doc_01);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113bd2;
          fVar12 = fdb_iterator_seek((fdb_iterator *)pfVar21,doc_01,sVar15 + 1,'\x01');
          if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011500e;
          pfVar21 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)(_Var23._M_i + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113bf9;
            fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar12 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c15;
            sprintf(doc_01,"key%06d",pfVar21);
            uVar19 = (int)pfVar21 -
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar19;
            pcVar56 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
              pcVar56 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c4b;
            sprintf(pcVar55,pcVar56,(ulong)uVar19);
            pcVar60 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
            paVar5 = ((avl_node *)&((filemgr *)pcVar60)->blocksize)->parent;
            pcVar56 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar60)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c63;
            iVar13 = bcmp(pcVar56,pcVar55,(size_t)paVar5);
            if (iVar13 != 0) goto LAB_00114faa;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c73;
            fdb_doc_free((fdb_doc *)pcVar60);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar21 = (fdb_kvs_handle *)(ulong)(uVar19 - 1);
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c89;
            fVar12 = fdb_iterator_prev(pfVar4);
          } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar21 != -1) goto LAB_00115013;
          fconfig_00 = (char *)((long)&((fdb_iterator *)fconfig_00)->handle + 1);
        } while ((fdb_iterator *)fconfig_00 != (fdb_iterator *)0x1e);
        pcVar56 = "key%06d+";
        fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx
        ;
        pcVar60 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        uVar24 = 0;
        do {
          if (uVar24 == 0x1e) goto LAB_00113dc7;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113cdb;
          sprintf(fconfig_00,"key%06d+",uVar24 & 0xffffffff);
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ce8;
          sVar15 = strlen(fconfig_00);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113cf9;
          fdb_iterator_seek(pfVar4,fconfig_00,sVar15 + 1,'\0');
          iVar13 = *(int *)(_Var23._M_i + uVar24 * 4 + -0x4f4);
          *(ulong *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes +
                    0x14) = uVar24 + 1;
          uVar62 = (ulong)((int)uVar24 + 2);
          if (iVar13 != 2) {
            uVar62 = uVar24 + 1 & 0xffffffff;
          }
          do {
            uVar19 = (uint)uVar62;
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d1e;
            fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar12 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d36;
            sprintf(fconfig_00,"key%06d+",uVar62);
            uVar19 = uVar19 + (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar19;
            pcVar55 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
              pcVar55 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d6c;
            sprintf(pcVar60,pcVar55,(ulong)uVar19);
            pcVar55 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
            aVar54 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar55 + 0x10);
            doc_01 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                             ((long)pcVar55 + 0x40))->seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d84;
            iVar13 = bcmp(doc_01,pcVar60,(size_t)aVar54);
            if (iVar13 != 0) goto LAB_00114fba;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d94;
            fdb_doc_free((fdb_doc *)pcVar55);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar19 = uVar19 + 1;
            uVar62 = (ulong)uVar19;
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113daa;
            fVar12 = fdb_iterator_next(pfVar4);
          } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
          uVar24 = *(ulong *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.
                              bytes + 0x14);
        } while (uVar19 == 0x1e);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113dc7;
        iterator_complete_test();
LAB_00113dc7:
        pcVar56 = "key%06d+";
        doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar55 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        pcVar60 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113df1;
          sprintf(doc_01,"key%06d+",(ulong)pcVar60 & 0xffffffff);
          fconfig_00 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                  enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113dfe;
          sVar15 = strlen(doc_01);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113e0f;
          fdb_iterator_seek((fdb_iterator *)fconfig_00,doc_01,sVar15 + 1,'\0');
          puVar1 = &((fdb_kvs_config *)&((filemgr *)pcVar60)->filename)->field_0x1;
          *(char **)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes +
                    0x14) = pcVar60;
          iVar13 = *(int *)(_Var23._M_i + (long)pcVar60 * 4 + -0x4f4);
          ((fdb_kvs_handle *)(_Var23._M_i + -0x618))->seqnum = (fdb_seqnum_t)puVar1;
          pfVar21 = (fdb_kvs_handle *)(ulong)((int)pcVar60 + 2);
          if (iVar13 != 2) {
            pfVar21 = (fdb_kvs_handle *)((ulong)puVar1 & 0xffffffff);
          }
          do {
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e3d;
            fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar12 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e55;
            sprintf(doc_01,"key%06d+",pfVar21);
            uVar19 = (int)pfVar21 -
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar19;
            pcVar60 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
              pcVar60 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e8b;
            sprintf(pcVar55,pcVar60,(ulong)uVar19);
            fconfig_00 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                 num_bgflusher_threads;
            pbVar6 = ((fdb_iterator *)fconfig_00)->seqtree_iterator;
            pcVar60 = (char *)((fdb_iterator *)fconfig_00)->tree_cursor_prev;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113ea3;
            iVar13 = bcmp(pcVar60,pcVar55,(size_t)pbVar6);
            if (iVar13 != 0) goto LAB_00114fca;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113eb3;
            fdb_doc_free((fdb_doc *)fconfig_00);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar21 = (fdb_kvs_handle *)(ulong)(uVar19 - 1);
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113ec9;
            fVar12 = fdb_iterator_prev(pfVar4);
          } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
          if (*(long *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes +
                       0x14) == 0x1d) {
            if ((int)pfVar21 != 0x1e) goto LAB_00115036;
          }
          else if ((int)pfVar21 != -1) goto LAB_0011503b;
          pcVar60 = (char *)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->seqnum;
        } while ((filemgr *)pcVar60 != (filemgr *)0x1e);
        doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar55 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        fconfig_00 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113f26;
          sprintf(doc_01,"key%06d+",(ulong)fconfig_00 & 0xffffffff);
          pfVar21 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113f33;
          sVar15 = strlen(doc_01);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113f47;
          fVar12 = fdb_iterator_seek((fdb_iterator *)pfVar21,doc_01,sVar15 + 1,'\x01');
          if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115018;
          pfVar21 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)(_Var23._M_i + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113f6e;
            fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar12 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113f8a;
            sprintf(doc_01,"key%06d+",pfVar21);
            uVar19 = (int)pfVar21 +
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar19;
            pcVar56 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
              pcVar56 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fc0;
            sprintf(pcVar55,pcVar56,(ulong)uVar19);
            pcVar60 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
            paVar5 = ((avl_node *)&((filemgr *)pcVar60)->blocksize)->parent;
            pcVar56 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar60)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fd8;
            iVar13 = bcmp(pcVar56,pcVar55,(size_t)paVar5);
            if (iVar13 != 0) goto LAB_00114fda;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fe8;
            fdb_doc_free((fdb_doc *)pcVar60);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar21 = (fdb_kvs_handle *)(ulong)(uVar19 + 1);
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113ffe;
            fVar12 = fdb_iterator_next(pfVar4);
          } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar21 != 0x1e) goto LAB_0011501d;
          fconfig_00 = (char *)((long)&((fdb_iterator *)fconfig_00)->handle + 1);
        } while ((fdb_iterator *)fconfig_00 != (fdb_iterator *)0x1e);
        doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar55 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        fconfig_00 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114043;
          sprintf(doc_01,"key%06d+",(ulong)fconfig_00 & 0xffffffff);
          pfVar21 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114050;
          sVar15 = strlen(doc_01);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114064;
          fVar12 = fdb_iterator_seek((fdb_iterator *)pfVar21,doc_01,sVar15 + 1,'\x01');
          if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115022;
          pfVar21 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)(_Var23._M_i + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11408b;
            fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar12 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140a7;
            sprintf(doc_01,"key%06d+",pfVar21);
            uVar19 = (int)pfVar21 -
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar19;
            pcVar56 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
              pcVar56 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140dd;
            sprintf(pcVar55,pcVar56,(ulong)uVar19);
            pcVar60 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
            paVar5 = ((avl_node *)&((filemgr *)pcVar60)->blocksize)->parent;
            pcVar56 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar60)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140f5;
            iVar13 = bcmp(pcVar56,pcVar55,(size_t)paVar5);
            if (iVar13 != 0) goto LAB_00114fea;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x114105;
            fdb_doc_free((fdb_doc *)pcVar60);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar21 = (fdb_kvs_handle *)(ulong)(uVar19 - 1);
            pfVar4 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11411b;
            fVar12 = fdb_iterator_prev(pfVar4);
          } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar21 != -1) goto LAB_00115027;
          fconfig_00 = (char *)((long)&((fdb_iterator *)fconfig_00)->handle + 1);
        } while ((fdb_iterator *)fconfig_00 != (fdb_iterator *)0x1e);
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114145;
        fVar12 = fdb_iterator_seek_to_min(pfVar4);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150e9;
        doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar56 = "value%08d";
        pcVar60 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        pfVar21 = (fdb_kvs_handle *)0x0;
        do {
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114176;
          fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                            num_bgflusher_threads);
          if (fVar12 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114192;
          sprintf(doc_01,"key%06d+",pfVar21);
          uVar19 = (int)pfVar21 +
                   (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
          pfVar21 = (fdb_kvs_handle *)(ulong)uVar19;
          pcVar55 = "value%08d";
          if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
            pcVar55 = "value%08d(WAL)";
          }
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1141c4;
          sprintf(pcVar60,pcVar55,(ulong)uVar19);
          pcVar55 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                            num_bgflusher_threads;
          aVar54 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar55 + 0x10);
          fconfig_00 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                               ((long)pcVar55 + 0x40))->seqtree;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1141dc;
          iVar13 = bcmp(fconfig_00,pcVar60,(size_t)aVar54);
          if (iVar13 != 0) goto LAB_00115040;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1141ec;
          fdb_doc_free((fdb_doc *)pcVar55);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
          pfVar21 = (fdb_kvs_handle *)(ulong)(uVar19 + 1);
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114202;
          fVar12 = fdb_iterator_next(pfVar4);
        } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pfVar21 != 0x1e) goto LAB_001150ee;
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11421f;
        fVar12 = fdb_iterator_seek_to_max(pfVar4);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150f3;
        fconfig_00 = (char *)0x1d;
        doc_01 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar56 = "value%08d";
        pcVar60 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        do {
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114252;
          fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                            num_bgflusher_threads);
          if (fVar12 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11426d;
          sprintf(doc_01,"key%06d+",fconfig_00);
          uVar19 = (int)fconfig_00 -
                   (uint)(*(int *)(_Var23._M_i + (long)(int)fconfig_00 * 4 + -0x4f8) == 2);
          fconfig_00 = (char *)(ulong)uVar19;
          pcVar55 = "value%08d";
          if (*(int *)(_Var23._M_i + (long)(int)uVar19 * 4 + -0x4f8) != 0) {
            pcVar55 = "value%08d(WAL)";
          }
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11429c;
          sprintf(pcVar60,pcVar55,(ulong)uVar19);
          pcVar55 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                            num_bgflusher_threads;
          aVar54 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar55 + 0x10);
          pfVar21 = (fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar55 + 0x40))->
                    seqtree;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142b4;
          iVar13 = bcmp(pfVar21,pcVar60,(size_t)aVar54);
          if (iVar13 != 0) goto LAB_00115050;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142c4;
          fdb_doc_free((fdb_doc *)pcVar55);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
          fconfig_00 = (char *)(ulong)(uVar19 - 1);
          pfVar4 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142d9;
          fVar12 = fdb_iterator_prev(pfVar4);
        } while (fVar12 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)fconfig_00 != -1) goto LAB_001150f8;
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142f5;
        fVar12 = fdb_iterator_close(pfVar4);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150fd;
        fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx
        ;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11431b;
        sprintf(fconfig_00,"key%06d",0x14);
        pfVar21 = *(fdb_kvs_handle **)
                   &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114328;
        sVar15 = strlen(fconfig_00);
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).max_writer_lock_prob =
             8;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114347;
        fVar12 = fdb_iterator_init(pfVar21,(fdb_iterator **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                            enable_background_compactor,(void *)0x0,0,fconfig_00,
                                   sVar15 + 1,
                                   (fdb_iterator_opt_t)
                                   (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                   max_writer_lock_prob);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115102;
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114359;
        fVar12 = fdb_iterator_seek_to_max(pfVar4);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115107;
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114370;
        fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                          num_bgflusher_threads);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011510c;
        pcVar60 = "value%08d";
        fconfig_00 = "value%08d(WAL)";
        pcVar56 = "value%08d(WAL)";
        if (*(int *)((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->log_callback).callback + 4)
            == 0) {
          pcVar56 = "value%08d";
        }
        doc_01 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143ac;
        sprintf(doc_01,pcVar56,0x13);
        pfVar21 = (fdb_kvs_handle *)
                  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads;
        pvVar63 = (pfVar21->kvs_config).custom_cmp_param;
        pcVar56 = (char *)(pfVar21->field_6).seqtree;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143c4;
        iVar13 = bcmp(pcVar56,doc_01,(size_t)pvVar63);
        if (iVar13 != 0) goto LAB_00115111;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143d4;
        fdb_doc_free((fdb_doc *)pfVar21);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143e7;
        fVar12 = fdb_iterator_close(pfVar4);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115121;
        pfVar21 = (fdb_kvs_handle *)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11440d;
        sprintf((char *)pfVar21,"key%06d",10);
        pcVar56 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11441a;
        sVar15 = strlen((char *)pfVar21);
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).max_writer_lock_prob =
             4;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11443b;
        fVar12 = fdb_iterator_init((fdb_kvs_handle *)pcVar56,
                                   (fdb_iterator **)
                                   &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                    enable_background_compactor,pfVar21,sVar15 + 1,(void *)0x0,0,
                                   (fdb_iterator_opt_t)
                                   (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                   max_writer_lock_prob);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115126;
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11444d;
        fVar12 = fdb_iterator_seek_to_min(pfVar4);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011512b;
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114464;
        fVar12 = fdb_iterator_get(pfVar4,(fdb_doc **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                          num_bgflusher_threads);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115130;
        if (*(int *)((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                            breakpad_minidump_dir + 4) == 0) {
          fconfig_00 = "value%08d";
        }
        pcVar56 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11448f;
        sprintf(pcVar56,fconfig_00,0xb);
        fconfig_00 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                             num_bgflusher_threads;
        pbVar6 = ((fdb_iterator *)fconfig_00)->seqtree_iterator;
        pfVar21 = (fdb_kvs_handle *)((fdb_iterator *)fconfig_00)->tree_cursor_prev;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144a7;
        iVar13 = bcmp(pfVar21,pcVar56,(size_t)pbVar6);
        if (iVar13 != 0) goto LAB_00115135;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144b7;
        fdb_doc_free((fdb_doc *)fconfig_00);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
        pfVar4 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144ca;
        fVar12 = fdb_iterator_close(pfVar4);
        fconfig_00 = (char *)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->kv_info_offset;
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115145;
        pfVar3 = *(fdb_file_handle **)
                  ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144e4;
        fVar12 = fdb_close(pfVar3);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011514a;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144f1;
        fVar12 = fdb_shutdown();
        if (fVar12 == FDB_RESULT_SUCCESS) {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144fe;
          memleak_end();
          (((fdb_kvs_handle *)(_Var23._M_i + -0x410))->bub_ctx).entries = (list *)0x20747365742065;
          ((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node = (kvs_opened_node *)0x726f746172657469;
          *(undefined8 *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->num_iterators =
               0x74656c706d6f6320;
          if ((int)fconfig_00 != 0) goto LAB_0011472c;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114534;
          sVar15 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
          builtin_strncpy((char *)(_Var23._M_i + (sVar15 - 0x238)),"(HB+trie: all, W",0x10);
          uVar65._0_1_ = ' ';
          uVar65._1_1_ = 'a';
          uVar65._2_1_ = 'l';
          uVar65._3_1_ = 'l';
          uVar67._0_1_ = ',';
          uVar67._1_1_ = ' ';
          uVar67._2_1_ = 'W';
          uVar67._3_1_ = 'A';
          uVar69._0_1_ = 'L';
          uVar69._1_1_ = ':';
          uVar69._2_1_ = ' ';
          uVar69._3_1_ = 'e';
          uVar71._0_1_ = 'v';
          uVar71._1_1_ = 'e';
          uVar71._2_1_ = 'n';
          uVar71._3_1_ = '\0';
          goto LAB_0011454a;
        }
        goto LAB_0011514f;
      }
      goto LAB_00115159;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135ad;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135ba;
    sVar15 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135c9;
    fVar12 = fdb_del_kv(pfVar21,fconfig_00,sVar15 + 1);
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011515e;
    pfVar3 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135e0;
    fVar12 = fdb_commit(pfVar3,'\x01');
    if (fVar12 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_001135f0;
    }
    goto LAB_00115163;
  }
  switch((int)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->kv_info_offset) {
  case 1:
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar56 = "value%08d";
    doc_01 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar57 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145c6;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar57 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145d6;
      sprintf(doc_01,"value%08d",(ulong)pfVar57 & 0xffffffff);
      pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145e3;
      sVar15 = strlen((char *)pfVar21);
      fconfig_00 = (char *)(sVar15 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145ef;
      sVar15 = strlen(doc_01);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114604;
      fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pfVar21,(size_t)fconfig_00,doc_01,sVar15 + 1);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115080;
      *(undefined4 *)(_Var23._M_i + (long)pfVar57 * 4 + -0x4f8) = 0;
      pfVar57 = (filemgr *)&((fdb_kvs_config *)&pfVar57->filename)->field_0x1;
    } while (pfVar57 != (filemgr *)0x1e);
    pfVar3 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11462d;
    fVar12 = fdb_commit(pfVar3,'\x01');
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115168;
    pcVar56 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    doc_01 = "value%08d(WAL)";
    pfVar57 = (filemgr *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar53 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114666;
      sprintf(pcVar56,"key%06d",(ulong)pfVar53 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114676;
      sprintf((char *)pfVar57,"value%08d(WAL)",(ulong)pfVar53 & 0xffffffff);
      pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114683;
      sVar15 = strlen(pcVar56);
      fconfig_00 = (char *)(sVar15 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11468f;
      sVar15 = strlen((char *)pfVar57);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146a4;
      fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pcVar56,(size_t)fconfig_00,pfVar57,sVar15 + 1);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011509e;
      *(undefined4 *)(_Var23._M_i + (long)pfVar53 * 4 + -0x4f8) = 1;
      pfVar21 = (fdb_kvs_handle *)&(pfVar53->kvs_config).field_0x2;
      bVar64 = pfVar53 < (fdb_kvs_handle *)0x1c;
      pfVar53 = pfVar21;
    } while (bVar64);
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        != 0) {
      fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146e7;
      sprintf(fconfig_00,"key%06d",0xf);
      pfVar21 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146f4;
      sVar15 = strlen(fconfig_00);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114703;
      fVar12 = fdb_del_kv(pfVar21,fconfig_00,sVar15 + 1);
      if (fVar12 == FDB_RESULT_SUCCESS) {
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks
             = 2;
        goto LAB_00114713;
      }
      goto LAB_0011519a;
    }
LAB_00114713:
    pfVar3 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11471f;
    fVar12 = fdb_commit(pfVar3,'\0');
    if (fVar12 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11472c;
    iterator_complete_test();
    break;
  case 2:
switchD_00114596_caseD_2:
    pcVar56 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    doc_01 = "value%08d";
    pfVar57 = (filemgr *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar21 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b97;
      sprintf(pcVar56,"key%06d",(ulong)pfVar21 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ba7;
      sprintf((char *)pfVar57,"value%08d",(ulong)pfVar21 & 0xffffffff);
      pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bb4;
      sVar15 = strlen(pcVar56);
      fconfig_00 = (char *)(sVar15 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bc0;
      sVar15 = strlen((char *)pfVar57);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bd5;
      fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pcVar56,(size_t)fconfig_00,pfVar57,sVar15 + 1);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115094;
      *(undefined4 *)(_Var23._M_i + (long)pfVar21 * 4 + -0x4f8) = 0;
      pfVar53 = (fdb_kvs_handle *)&(pfVar21->kvs_config).field_0x2;
      bVar64 = pfVar21 < (fdb_kvs_handle *)0x1c;
      pfVar21 = pfVar53;
    } while (bVar64);
    pfVar3 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c02;
    fVar12 = fdb_commit(pfVar3,'\x01');
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011517c;
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114c72:
      pfVar21 = (fdb_kvs_handle *)
                &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
      pcVar56 = "value%08d(WAL)";
      doc_01 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
      pcVar60 = (char *)(filemgr *)0x0;
      do {
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ca0;
        sprintf((char *)pfVar21,"key%06d",(ulong)pcVar60 & 0xffffffff);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cb0;
        sprintf(doc_01,"value%08d(WAL)",(ulong)pcVar60 & 0xffffffff);
        pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cbd;
        sVar15 = strlen((char *)pfVar21);
        fconfig_00 = (char *)(sVar15 + 1);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cc9;
        sVar15 = strlen(doc_01);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cde;
        fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pfVar21,(size_t)fconfig_00,doc_01,sVar15 + 1);
        if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150ad;
        *(undefined4 *)(_Var23._M_i + (long)pcVar60 * 4 + -0x4f8) = 1;
        pfVar57 = (filemgr *)&((fdb_kvs_config *)&((filemgr *)pcVar60)->filename)->field_0x2;
        bVar64 = pcVar60 < (filemgr *)0x1c;
        pcVar60 = (char *)pfVar57;
      } while (bVar64);
      pfVar3 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d08;
      fVar12 = fdb_commit(pfVar3,'\0');
      if (fVar12 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d15;
      iterator_complete_test();
      goto switchD_00114596_default;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c2f;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c3c;
    sVar15 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c4b;
    fVar12 = fdb_del_kv(pfVar21,fconfig_00,sVar15 + 1);
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115190;
    pfVar3 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c62;
    fVar12 = fdb_commit(pfVar3,'\x01');
    if (fVar12 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114c72;
    }
    goto LAB_00115195;
  case 3:
switchD_00114596_caseD_3:
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar56 = "value%08d";
    doc_01 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar61 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148f2;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar61 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114902;
      sprintf(doc_01,"value%08d",(ulong)pfVar61 & 0xffffffff);
      pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11490f;
      sVar15 = strlen((char *)pfVar21);
      fconfig_00 = (char *)(sVar15 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11491b;
      sVar15 = strlen(doc_01);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114930;
      fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pfVar21,(size_t)fconfig_00,doc_01,sVar15 + 1);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011508a;
      *(undefined4 *)(_Var23._M_i + (long)pfVar61 * 4 + -0x4f8) = 0;
      pfVar57 = (filemgr *)&((fdb_kvs_config *)&pfVar61->filename)->field_0x2;
      bVar64 = pfVar61 < (filemgr *)0x1c;
      pfVar61 = pfVar57;
    } while (bVar64);
    pfVar3 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11495d;
    fVar12 = fdb_commit(pfVar3,'\x01');
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115172;
    pcVar56 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    doc_01 = "value%08d(WAL)";
    pfVar57 = (filemgr *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar53 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114996;
      sprintf(pcVar56,"key%06d",(ulong)pfVar53 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149a6;
      sprintf((char *)pfVar57,"value%08d(WAL)",(ulong)pfVar53 & 0xffffffff);
      pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149b3;
      sVar15 = strlen(pcVar56);
      fconfig_00 = (char *)(sVar15 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149bf;
      sVar15 = strlen((char *)pfVar57);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149d4;
      fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pcVar56,(size_t)fconfig_00,pfVar57,sVar15 + 1);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150a3;
      *(undefined4 *)(_Var23._M_i + (long)pfVar53 * 4 + -0x4f8) = 1;
      pfVar21 = (fdb_kvs_handle *)&(pfVar53->kvs_config).field_0x2;
      bVar64 = pfVar53 < (fdb_kvs_handle *)0x1c;
      pfVar53 = pfVar21;
    } while (bVar64);
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114a43:
      pfVar3 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a4f;
      fVar12 = fdb_commit(pfVar3,'\0');
      if (fVar12 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a5c;
      iterator_complete_test();
      goto switchD_00114596_caseD_4;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a17;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a24;
    sVar15 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a33;
    fVar12 = fdb_del_kv(pfVar21,fconfig_00,sVar15 + 1);
    if (fVar12 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114a43;
    }
    goto LAB_0011519f;
  case 4:
switchD_00114596_caseD_4:
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar56 = "value%08d";
    doc_01 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar57 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a8a;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar57 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a9a;
      sprintf(doc_01,"value%08d",(ulong)pfVar57 & 0xffffffff);
      pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114aa7;
      sVar15 = strlen((char *)pfVar21);
      fconfig_00 = (char *)(sVar15 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ab3;
      sVar15 = strlen(doc_01);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ac8;
      fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pfVar21,(size_t)fconfig_00,doc_01,sVar15 + 1);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011508f;
      *(undefined4 *)(_Var23._M_i + (long)pfVar57 * 4 + -0x4f8) = 0;
      pfVar57 = (filemgr *)&((fdb_kvs_config *)&pfVar57->filename)->field_0x1;
    } while (pfVar57 != (filemgr *)0x1e);
    pfVar3 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114af1;
    fVar12 = fdb_commit(pfVar3,'\x01');
    pfVar53 = pfVar21;
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115177;
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114b4a:
      pfVar3 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b59;
      fVar12 = fdb_commit(pfVar3,'\x01');
      if (fVar12 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b66;
      iterator_complete_test();
      goto switchD_00114596_caseD_2;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b1e;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b2b;
    sVar15 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b3a;
    fVar12 = fdb_del_kv(pfVar21,fconfig_00,sVar15 + 1);
    if (fVar12 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114b4a;
    }
    goto LAB_0011518b;
  case 5:
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar56 = "value%08d";
    doc_01 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar57 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147ee;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar57 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147fe;
      sprintf(doc_01,"value%08d",(ulong)pfVar57 & 0xffffffff);
      pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11480b;
      sVar15 = strlen((char *)pfVar21);
      fconfig_00 = (char *)(sVar15 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114817;
      sVar15 = strlen(doc_01);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11482c;
      fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pfVar21,(size_t)fconfig_00,doc_01,sVar15 + 1);
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115085;
      *(undefined4 *)(_Var23._M_i + (long)pfVar57 * 4 + -0x4f8) = 0;
      pfVar57 = (filemgr *)&((fdb_kvs_config *)&pfVar57->filename)->field_0x1;
    } while (pfVar57 != (filemgr *)0x1e);
    pfVar3 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114852;
    fVar12 = fdb_commit(pfVar3,'\0');
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_0011516d;
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_001148ab:
      pfVar3 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148b7;
      fVar12 = fdb_commit(pfVar3,'\0');
      if (fVar12 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148c4;
      iterator_complete_test();
      goto switchD_00114596_caseD_3;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11487f;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11488c;
    sVar15 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11489b;
    fVar12 = fdb_del_kv(pfVar21,fconfig_00,sVar15 + 1);
    if (fVar12 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_001148ab;
    }
    goto LAB_00115186;
  default:
switchD_00114596_default:
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar56 = "value%08d";
    doc_01 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar57 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d43;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar57 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d53;
      sprintf(doc_01,"value%08d",(ulong)pfVar57 & 0xffffffff);
      pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d60;
      sVar15 = strlen((char *)pfVar21);
      fconfig_00 = (char *)(sVar15 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d6c;
      sVar15 = strlen(doc_01);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d81;
      fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pfVar21,(size_t)fconfig_00,doc_01,sVar15 + 1);
      pfVar53 = pfVar21;
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115099;
      *(undefined4 *)(_Var23._M_i + (long)pfVar57 * 4 + -0x4f8) = 0;
      pfVar57 = (filemgr *)&((fdb_kvs_config *)&pfVar57->filename)->field_0x1;
    } while (pfVar57 != (filemgr *)0x1e);
    pfVar3 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114daa;
    fVar12 = fdb_commit(pfVar3,'\x01');
    if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_00115181;
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar56 = "value%08d(WAL)";
    doc_01 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar57 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114de0;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar57 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114df0;
      sprintf(doc_01,"value%08d(WAL)",(ulong)pfVar57 & 0xffffffff);
      pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114dfd;
      sVar15 = strlen((char *)pfVar21);
      fconfig_00 = (char *)(sVar15 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e09;
      sVar15 = strlen(doc_01);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e1e;
      fVar12 = fdb_set_kv((fdb_kvs_handle *)pcVar55,pfVar21,(size_t)fconfig_00,doc_01,sVar15 + 1);
      pcVar60 = (char *)pfVar57;
      if (fVar12 != FDB_RESULT_SUCCESS) goto LAB_001150a8;
      *(undefined4 *)(_Var23._M_i + (long)pfVar57 * 4 + -0x4f8) = 1;
      pfVar57 = (filemgr *)&((fdb_kvs_config *)&pfVar57->filename)->field_0x1;
    } while (pfVar57 != (filemgr *)0x1e);
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114e89:
      pfVar3 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e95;
      fVar12 = fdb_commit(pfVar3,'\0');
      if (fVar12 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ea2;
      iterator_complete_test();
switchD_00114745_caseD_5:
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114eaf;
      sVar15 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
      builtin_strncpy((char *)(_Var23._M_i + (sVar15 - 0x238)),"(HB+trie: empty,",0x10);
      uVar66._0_1_ = 'e';
      uVar66._1_1_ = 'm';
      uVar66._2_1_ = 'p';
      uVar66._3_1_ = 't';
      uVar68._0_1_ = 'y';
      uVar68._1_1_ = ',';
      uVar68._2_1_ = ' ';
      uVar68._3_1_ = 'W';
      uVar70._0_1_ = 'A';
      uVar70._1_1_ = 'L';
      uVar70._2_1_ = ':';
      uVar70._3_1_ = ' ';
      uVar72._0_1_ = 'a';
      uVar72._1_1_ = 'l';
      uVar72._2_1_ = 'l';
      uVar72._3_1_ = '\0';
LAB_00114f12:
      pcVar56 = (char *)(_Var23._M_i + (sVar15 - 0x22e));
      *(undefined4 *)pcVar56 = uVar66;
      *(undefined4 *)(pcVar56 + 4) = uVar68;
      *(undefined4 *)(pcVar56 + 8) = uVar70;
      *(undefined4 *)(pcVar56 + 0xc) = uVar72;
      goto switchD_00114745_default;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e5d;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e6a;
    sVar15 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e79;
    fVar12 = fdb_del_kv(pfVar21,fconfig_00,sVar15 + 1);
    if (fVar12 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114e89;
    }
    goto LAB_001151a4;
  }
LAB_0011472c:
  switch((int)fconfig_00) {
  case 1:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114754;
    sVar15 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
    *(undefined8 *)(_Var23._M_i + (sVar15 - 0x228)) = 0x64646f203a4c41;
    break;
  case 2:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f2c;
    sVar15 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var23._M_i + (sVar15 - 0x238)),"(HB+trie: odd, W",0x10);
    uVar65._0_1_ = ' ';
    uVar65._1_1_ = 'o';
    uVar65._2_1_ = 'd';
    uVar65._3_1_ = 'd';
    uVar67._0_1_ = ',';
    uVar67._1_1_ = ' ';
    uVar67._2_1_ = 'W';
    uVar67._3_1_ = 'A';
    uVar69._0_1_ = 'L';
    uVar69._1_1_ = ':';
    uVar69._2_1_ = ' ';
    uVar69._3_1_ = 'e';
    uVar71._0_1_ = 'v';
    uVar71._1_1_ = 'e';
    uVar71._2_1_ = 'n';
    uVar71._3_1_ = '\0';
    goto LAB_0011454a;
  case 3:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ed4;
    sVar15 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var23._M_i + (sVar15 - 0x238)),"(HB+trie: even, ",0x10);
    uVar65._0_1_ = ' ';
    uVar65._1_1_ = 'e';
    uVar65._2_1_ = 'v';
    uVar65._3_1_ = 'e';
    uVar67._0_1_ = 'n';
    uVar67._1_1_ = ',';
    uVar67._2_1_ = ' ';
    uVar67._3_1_ = 'W';
    uVar69._0_1_ = 'A';
    uVar69._1_1_ = 'L';
    uVar69._2_1_ = ':';
    uVar69._3_1_ = ' ';
    uVar71._0_1_ = 'o';
    uVar71._1_1_ = 'd';
    uVar71._2_1_ = 'd';
    uVar71._3_1_ = '\0';
LAB_0011454a:
    pcVar56 = (char *)(_Var23._M_i + (sVar15 - 0x22f));
    *(undefined4 *)pcVar56 = uVar65;
    *(undefined4 *)(pcVar56 + 4) = uVar67;
    *(undefined4 *)(pcVar56 + 8) = uVar69;
    *(undefined4 *)(pcVar56 + 0xc) = uVar71;
    goto switchD_00114745_default;
  case 4:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114efc;
    sVar15 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var23._M_i + (sVar15 - 0x238)),"(HB+trie: all, W",0x10);
    uVar66._0_1_ = 'a';
    uVar66._1_1_ = 'l';
    uVar66._2_1_ = 'l';
    uVar66._3_1_ = ',';
    uVar68._0_1_ = ' ';
    uVar68._1_1_ = 'W';
    uVar68._2_1_ = 'A';
    uVar68._3_1_ = 'L';
    uVar70._0_1_ = ':';
    uVar70._1_1_ = ' ';
    uVar70._2_1_ = 'e';
    uVar70._3_1_ = 'm';
    uVar72._0_1_ = 'p';
    uVar72._1_1_ = 't';
    uVar72._2_1_ = 'y';
    uVar72._3_1_ = '\0';
    goto LAB_00114f12;
  case 5:
    goto switchD_00114745_caseD_5;
  case 6:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f54;
    sVar15 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
    *(undefined8 *)(_Var23._M_i + (sVar15 - 0x228)) = 0x6c6c61203a4c41;
    break;
  default:
    goto switchD_00114745_default;
  }
  builtin_strncpy((char *)(_Var23._M_i + (sVar15 - 0x238)),"(HB+trie: all, W",0x10);
switchD_00114745_default:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11455f;
  sVar15 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
  pcVar56 = (char *)(_Var23._M_i + (sVar15 - 0x238));
  if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10) ==
      0) {
    pcVar56[0] = ')';
    pcVar56[1] = '\0';
  }
  else {
    builtin_strncpy(pcVar56,", do",4);
    builtin_strncpy((char *)(_Var23._M_i + (sVar15 - 0x234)),"c de",4);
    builtin_strncpy((char *)(_Var23._M_i + (sVar15 - 0x230)),"leti",4);
    builtin_strncpy((char *)(_Var23._M_i + (sVar15 - 0x22c)),"on)",4);
  }
  pcVar56 = "%s PASSED\n";
  if (iterator_complete_test(int,int)::__test_pass != '\0') {
    pcVar56 = "%s FAILED\n";
  }
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147ae;
  fprintf(_stderr,pcVar56,&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
  return;
}

Assistant:

void iterator_compact_uncommitted_db()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 10;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_iterator *it;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db1", &kvs_config);


    // set docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_set_kv(db, keybuf, strlen(keybuf),
                bodybuf, strlen(bodybuf));
    }

    // count number of iteratable docs
    status = fdb_iterator_sequence_init(db, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i=0;
    do { ++i; }
    while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);
    TEST_CHK(i == n);

    // compact
    fdb_compact(dbfile, NULL);

    // set again
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_set_kv(db, keybuf, strlen(keybuf),
                bodybuf, strlen(bodybuf));
    }

    // count number of iteratable docs
    status = fdb_iterator_sequence_init(db, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i=0;
    do { ++i; }
    while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);
    TEST_CHK(i == n);


    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator compact uncommitted db");
}